

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack16to4.h
# Opt level: O0

void ncnn::convolution_pack16to4_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined8 uVar107;
  undefined8 uVar108;
  undefined8 uVar109;
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined8 uVar117;
  undefined8 uVar118;
  undefined8 uVar119;
  undefined8 uVar120;
  undefined8 uVar121;
  undefined8 uVar122;
  undefined8 uVar123;
  undefined8 uVar124;
  undefined8 uVar125;
  undefined8 uVar126;
  undefined8 uVar127;
  undefined8 uVar128;
  undefined8 uVar129;
  undefined8 uVar130;
  undefined8 uVar131;
  undefined8 uVar132;
  undefined8 uVar133;
  undefined8 uVar134;
  undefined8 uVar135;
  undefined8 uVar136;
  undefined8 uVar137;
  undefined8 uVar138;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar139;
  float fVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  long *in_stack_00000030;
  __m128 _wf;
  __m128 _we;
  __m128 _wd;
  __m128 _wc;
  __m128 _wb;
  __m128 _wa;
  __m128 _w9;
  __m128 _w8;
  __m128 _w7;
  __m128 _w6;
  __m128 _w5;
  __m128 _w4;
  __m128 _w3;
  __m128 _w2;
  __m128 _w1;
  __m128 _w0;
  __m128 _valf;
  __m128 _vale;
  __m128 _vald;
  __m128 _valc;
  __m128 _valb;
  __m128 _vala;
  __m128 _val9;
  __m128 _val8;
  __m128 _val7;
  __m128 _val6;
  __m128 _val5;
  __m128 _val4;
  __m128 _val3;
  __m128 _val2;
  __m128 _val1;
  __m128 _val0;
  float *slptr;
  int k;
  float *sptr;
  Mat m_2;
  int q;
  float *kptr;
  __m128 _sum;
  int j_1;
  int i_1;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  float in_stack_ffffffffffffd420;
  float in_stack_ffffffffffffd424;
  undefined1 in_stack_ffffffffffffd428 [16];
  undefined8 local_2ba8;
  undefined8 uStack_2ba0;
  undefined8 local_2b88;
  undefined8 uStack_2b80;
  undefined8 local_2b58;
  undefined8 uStack_2b50;
  undefined8 local_2b28;
  undefined8 uStack_2b20;
  int local_2744;
  undefined8 local_2738;
  undefined8 local_2730;
  undefined8 local_2728;
  undefined4 local_2720;
  long local_2718;
  undefined4 local_2710;
  undefined4 local_270c;
  undefined4 local_2708;
  undefined4 local_2704;
  undefined4 local_2700;
  undefined8 local_26f8;
  int local_26ec;
  undefined8 local_26e8;
  undefined8 local_26e0;
  undefined8 local_26d8;
  undefined4 local_26d0;
  long local_26c8;
  undefined4 local_26c0;
  undefined4 local_26bc;
  undefined4 local_26b8;
  undefined4 local_26b4;
  undefined4 local_26b0;
  undefined8 local_26a8;
  undefined1 (*local_26a0) [16];
  undefined1 local_2698 [16];
  int local_2688;
  int local_2684;
  undefined8 local_2680;
  undefined8 local_2678;
  undefined8 local_2670;
  undefined4 local_2668;
  long local_2660;
  undefined4 local_2658;
  undefined4 local_2654;
  undefined4 local_2650;
  undefined4 local_264c;
  undefined4 local_2648;
  undefined8 local_2640;
  undefined8 *local_2638;
  int local_262c;
  long local_2628;
  int local_261c;
  int local_2618;
  int local_2614;
  int local_2610;
  int local_260c;
  reference local_2608;
  vector<int,_std::allocator<int>_> local_25e8;
  int local_25d0;
  int local_25cc;
  int local_25c8;
  int local_25c4;
  int local_25c0;
  int local_25bc;
  int local_25b8;
  int local_25b4;
  long *local_25b0;
  long *local_25a8;
  long *local_25a0;
  long *local_2598;
  undefined8 *local_2590;
  undefined8 *local_2580;
  undefined8 *local_2570;
  undefined8 *local_2548;
  undefined8 *local_2528;
  undefined8 *local_2508;
  undefined1 local_24fd;
  int local_24fc;
  undefined8 *local_24f0;
  undefined8 *local_24d0;
  undefined8 *local_24c8;
  long *local_24c0;
  int local_24b4;
  undefined8 *local_24b0;
  undefined1 local_24a5;
  int local_24a4;
  undefined8 *local_2498;
  undefined1 local_2475;
  int local_2474;
  undefined8 *local_2468;
  undefined1 (*local_2400) [16];
  undefined1 (*local_23f8) [16];
  undefined1 (*local_23f0) [16];
  undefined1 (*local_23e8) [16];
  undefined1 (*local_23e0) [16];
  undefined1 (*local_23d8) [16];
  undefined1 (*local_23d0) [16];
  undefined1 (*local_23c8) [16];
  undefined1 (*local_23c0) [16];
  undefined1 (*local_23b8) [16];
  undefined1 (*local_23b0) [16];
  undefined1 (*local_23a8) [16];
  undefined1 (*local_23a0) [16];
  undefined1 (*local_2398) [16];
  undefined1 (*local_2390) [16];
  undefined1 (*local_2388) [16];
  undefined1 (*local_2380) [16];
  undefined8 local_2378;
  undefined8 uStack_2370;
  undefined8 local_2368;
  undefined8 uStack_2360;
  undefined8 local_2358;
  undefined8 uStack_2350;
  undefined8 local_2348;
  undefined8 uStack_2340;
  undefined8 local_2338;
  undefined8 uStack_2330;
  undefined8 local_2328;
  undefined8 uStack_2320;
  undefined8 local_2318;
  undefined8 uStack_2310;
  undefined8 local_2308;
  undefined8 uStack_2300;
  undefined8 local_22f8;
  undefined8 uStack_22f0;
  undefined8 local_22e8;
  undefined8 uStack_22e0;
  undefined8 local_22d8;
  undefined8 uStack_22d0;
  undefined8 local_22c8;
  undefined8 uStack_22c0;
  undefined8 local_22b8;
  undefined8 uStack_22b0;
  undefined8 local_22a8;
  undefined8 uStack_22a0;
  undefined8 local_2298;
  undefined8 uStack_2290;
  undefined8 local_2288;
  undefined8 uStack_2280;
  undefined8 local_2278;
  undefined8 uStack_2270;
  undefined8 local_2268;
  undefined8 uStack_2260;
  undefined8 local_2258;
  undefined8 uStack_2250;
  undefined8 local_2248;
  undefined8 uStack_2240;
  undefined8 local_2238;
  undefined8 uStack_2230;
  undefined8 local_2228;
  undefined8 uStack_2220;
  undefined8 local_2218;
  undefined8 uStack_2210;
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  undefined8 local_21e8;
  undefined8 uStack_21e0;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  undefined8 local_21b8;
  undefined8 uStack_21b0;
  undefined8 local_21a8;
  undefined8 uStack_21a0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined8 local_2188;
  undefined8 uStack_2180;
  undefined8 local_2178;
  undefined8 uStack_2170;
  undefined8 local_2168;
  undefined8 uStack_2160;
  undefined8 local_2158;
  undefined8 uStack_2150;
  undefined8 local_2148;
  undefined8 uStack_2140;
  undefined8 local_2138;
  undefined8 uStack_2130;
  undefined8 local_2128;
  undefined8 uStack_2120;
  undefined8 local_2118;
  undefined8 uStack_2110;
  undefined8 local_2108;
  undefined8 uStack_2100;
  undefined8 local_20f8;
  undefined8 uStack_20f0;
  undefined8 local_20e8;
  undefined8 uStack_20e0;
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined8 local_20c8;
  undefined8 uStack_20c0;
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  undefined8 local_20a8;
  undefined8 uStack_20a0;
  undefined8 local_2098;
  undefined8 uStack_2090;
  undefined8 local_2088;
  undefined8 uStack_2080;
  undefined1 local_2078 [16];
  undefined4 local_2068;
  undefined4 uStack_2064;
  undefined4 uStack_2060;
  undefined4 uStack_205c;
  undefined4 local_2054;
  undefined4 *local_2050;
  undefined4 local_2048;
  undefined4 uStack_2044;
  undefined4 uStack_2040;
  undefined4 uStack_203c;
  undefined4 local_2034;
  undefined4 *local_2030;
  undefined4 local_2028;
  undefined4 uStack_2024;
  undefined4 uStack_2020;
  undefined4 uStack_201c;
  undefined4 local_2014;
  undefined4 *local_2010;
  undefined4 local_2008;
  undefined4 uStack_2004;
  undefined4 uStack_2000;
  undefined4 uStack_1ffc;
  undefined4 local_1ff4;
  undefined4 *local_1ff0;
  undefined4 local_1fe8;
  undefined4 uStack_1fe4;
  undefined4 uStack_1fe0;
  undefined4 uStack_1fdc;
  undefined4 local_1fd4;
  undefined4 *local_1fd0;
  undefined4 local_1fc8;
  undefined4 uStack_1fc4;
  undefined4 uStack_1fc0;
  undefined4 uStack_1fbc;
  undefined4 local_1fb4;
  undefined4 *local_1fb0;
  undefined4 local_1fa8;
  undefined4 uStack_1fa4;
  undefined4 uStack_1fa0;
  undefined4 uStack_1f9c;
  undefined4 local_1f94;
  undefined4 *local_1f90;
  undefined4 local_1f88;
  undefined4 uStack_1f84;
  undefined4 uStack_1f80;
  undefined4 uStack_1f7c;
  undefined4 local_1f74;
  undefined4 *local_1f70;
  undefined4 local_1f68;
  undefined4 uStack_1f64;
  undefined4 uStack_1f60;
  undefined4 uStack_1f5c;
  undefined4 local_1f54;
  undefined4 *local_1f50;
  undefined4 local_1f48;
  undefined4 uStack_1f44;
  undefined4 uStack_1f40;
  undefined4 uStack_1f3c;
  undefined4 local_1f34;
  undefined4 *local_1f30;
  undefined4 local_1f28;
  undefined4 uStack_1f24;
  undefined4 uStack_1f20;
  undefined4 uStack_1f1c;
  undefined4 local_1f14;
  undefined4 *local_1f10;
  undefined4 local_1f08;
  undefined4 uStack_1f04;
  undefined4 uStack_1f00;
  undefined4 uStack_1efc;
  undefined4 local_1ef4;
  undefined4 *local_1ef0;
  undefined4 local_1ee8;
  undefined4 uStack_1ee4;
  undefined4 uStack_1ee0;
  undefined4 uStack_1edc;
  undefined4 local_1ed4;
  undefined4 *local_1ed0;
  undefined4 local_1ec8;
  undefined4 uStack_1ec4;
  undefined4 uStack_1ec0;
  undefined4 uStack_1ebc;
  undefined4 local_1eb4;
  undefined4 *local_1eb0;
  undefined4 local_1ea8;
  undefined4 uStack_1ea4;
  undefined4 uStack_1ea0;
  undefined4 uStack_1e9c;
  undefined4 local_1e94;
  undefined4 *local_1e90;
  undefined4 local_1e88;
  undefined4 uStack_1e84;
  undefined4 uStack_1e80;
  undefined4 uStack_1e7c;
  undefined4 local_1e74;
  undefined4 *local_1e70;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined8 local_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  undefined8 local_1e38;
  undefined8 uStack_1e30;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined1 local_1e08 [8];
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  long *local_1df0;
  undefined8 local_1de8;
  long *local_1de0;
  undefined8 local_1dd8;
  long *local_1dd0;
  undefined8 local_1dc8;
  long *local_1dc0;
  undefined8 local_1db8;
  long *local_1db0;
  undefined1 local_1da8 [16];
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  undefined8 *local_1d80;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined1 local_1d38 [16];
  undefined1 local_1d28 [16];
  float local_1d0c;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  undefined1 local_1cf8 [16];
  undefined1 local_1ce8 [16];
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  float local_1cb8;
  float fStack_1cb4;
  float fStack_1cb0;
  float fStack_1cac;
  float local_1c9c;
  undefined4 local_1c98;
  undefined4 uStack_1c94;
  undefined4 uStack_1c90;
  undefined4 uStack_1c8c;
  undefined4 local_1c7c;
  undefined4 local_1c78;
  undefined4 uStack_1c74;
  undefined4 uStack_1c70;
  undefined4 uStack_1c6c;
  undefined4 local_1c5c;
  float local_1c58;
  float fStack_1c54;
  float fStack_1c50;
  float fStack_1c4c;
  float local_1c3c;
  float local_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  float local_1c1c;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined1 local_1be8 [16];
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined1 local_1bb8 [16];
  undefined4 local_1ba8;
  undefined4 uStack_1ba4;
  undefined4 uStack_1ba0;
  undefined4 uStack_1b9c;
  undefined4 local_1b8c;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined4 local_1b78;
  undefined4 uStack_1b74;
  undefined4 uStack_1b70;
  undefined4 uStack_1b6c;
  undefined4 local_1b5c;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined1 local_1b48 [8];
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined1 local_1b28 [16];
  undefined1 local_1b18 [16];
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined4 local_1ae8;
  undefined4 uStack_1ae4;
  undefined4 uStack_1ae0;
  undefined4 uStack_1adc;
  undefined4 local_1acc;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  float local_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined1 local_1a58 [16];
  float local_1a48;
  float fStack_1a44;
  float fStack_1a40;
  float fStack_1a3c;
  undefined1 local_1a38 [8];
  float fStack_1a30;
  float fStack_1a2c;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined1 local_1a18 [8];
  float fStack_1a10;
  float fStack_1a0c;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined1 local_19d8 [12];
  float fStack_19cc;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined1 local_19b8 [16];
  float local_19a8;
  float fStack_19a4;
  float fStack_19a0;
  float fStack_199c;
  undefined1 local_1998 [16];
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined1 local_1968 [16];
  undefined4 local_1958;
  undefined4 uStack_1954;
  undefined4 uStack_1950;
  undefined4 uStack_194c;
  undefined1 local_1948 [16];
  undefined1 local_1938 [8];
  undefined8 uStack_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined1 local_1918 [16];
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined4 local_18d8;
  undefined4 uStack_18d4;
  undefined4 uStack_18d0;
  undefined4 uStack_18cc;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined4 local_18a8;
  undefined4 uStack_18a4;
  undefined4 uStack_18a0;
  undefined4 uStack_189c;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined4 local_1878;
  undefined4 uStack_1874;
  undefined4 uStack_1870;
  undefined4 uStack_186c;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined4 local_1848;
  undefined4 uStack_1844;
  undefined4 uStack_1840;
  undefined4 uStack_183c;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined4 local_1818;
  undefined4 uStack_1814;
  undefined4 uStack_1810;
  undefined4 uStack_180c;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined1 local_16c8 [16];
  undefined4 local_16b8;
  undefined4 uStack_16b4;
  undefined4 uStack_16b0;
  undefined4 uStack_16ac;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined4 local_1698;
  undefined4 uStack_1694;
  undefined4 uStack_1690;
  undefined4 uStack_168c;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined4 local_1658;
  undefined4 uStack_1654;
  undefined4 uStack_1650;
  undefined4 uStack_164c;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined4 local_15f8;
  undefined4 uStack_15f4;
  undefined4 uStack_15f0;
  undefined4 uStack_15ec;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined1 local_15b8 [16];
  undefined4 local_15a8;
  undefined4 uStack_15a4;
  undefined4 uStack_15a0;
  undefined4 uStack_159c;
  undefined1 local_1598 [16];
  undefined1 local_1588 [8];
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined1 local_1568 [16];
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined4 local_1528;
  undefined4 uStack_1524;
  undefined4 uStack_1520;
  undefined4 uStack_151c;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined4 local_14f8;
  undefined4 uStack_14f4;
  undefined4 uStack_14f0;
  undefined4 uStack_14ec;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined4 local_14c8;
  undefined4 uStack_14c4;
  undefined4 uStack_14c0;
  undefined4 uStack_14bc;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined4 local_1498;
  undefined4 uStack_1494;
  undefined4 uStack_1490;
  undefined4 uStack_148c;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined4 local_1468;
  undefined4 uStack_1464;
  undefined4 uStack_1460;
  undefined4 uStack_145c;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined1 local_1318 [16];
  undefined4 local_1308;
  undefined4 uStack_1304;
  undefined4 uStack_1300;
  undefined4 uStack_12fc;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined4 local_12e8;
  undefined4 uStack_12e4;
  undefined4 uStack_12e0;
  undefined4 uStack_12dc;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined4 local_12a8;
  undefined4 uStack_12a4;
  undefined4 uStack_12a0;
  undefined4 uStack_129c;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined4 local_1248;
  undefined4 uStack_1244;
  undefined4 uStack_1240;
  undefined4 uStack_123c;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined4 local_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined4 local_10a8;
  undefined4 uStack_10a4;
  undefined4 uStack_10a0;
  undefined4 uStack_109c;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined4 local_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined4 local_1048;
  undefined4 uStack_1044;
  undefined4 uStack_1040;
  undefined4 uStack_103c;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined4 local_fdc;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined4 local_fbc;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined4 local_e98;
  undefined4 uStack_e94;
  undefined4 uStack_e90;
  undefined4 uStack_e8c;
  undefined4 local_e7c;
  undefined4 local_e78;
  undefined4 uStack_e74;
  undefined4 uStack_e70;
  undefined4 uStack_e6c;
  undefined4 local_e5c;
  undefined8 local_e58;
  undefined8 uStack_e50;
  float local_e48;
  float fStack_e44;
  float fStack_e40;
  float fStack_e3c;
  undefined1 local_e38 [16];
  undefined4 local_e28;
  undefined4 uStack_e24;
  undefined4 uStack_e20;
  undefined4 uStack_e1c;
  undefined4 local_e0c;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined1 local_df8 [16];
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined1 local_dd8 [8];
  float fStack_dd0;
  float fStack_dcc;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  float local_da8;
  float fStack_da4;
  float fStack_da0;
  float fStack_d9c;
  undefined1 local_d98 [16];
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined1 local_d68 [16];
  undefined4 local_d58;
  undefined4 uStack_d54;
  undefined4 uStack_d50;
  undefined4 uStack_d4c;
  undefined1 local_d48 [16];
  undefined1 local_d38 [8];
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined1 local_d18 [16];
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined4 local_cd8;
  undefined4 uStack_cd4;
  undefined4 uStack_cd0;
  undefined4 uStack_ccc;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined4 local_ca8;
  undefined4 uStack_ca4;
  undefined4 uStack_ca0;
  undefined4 uStack_c9c;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined4 local_c78;
  undefined4 uStack_c74;
  undefined4 uStack_c70;
  undefined4 uStack_c6c;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined4 local_c48;
  undefined4 uStack_c44;
  undefined4 uStack_c40;
  undefined4 uStack_c3c;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined4 local_c18;
  undefined4 uStack_c14;
  undefined4 uStack_c10;
  undefined4 uStack_c0c;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined1 local_ac8 [16];
  undefined4 local_ab8;
  undefined4 uStack_ab4;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined4 local_a98;
  undefined4 uStack_a94;
  undefined4 uStack_a90;
  undefined4 uStack_a8c;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined4 local_a58;
  undefined4 uStack_a54;
  undefined4 uStack_a50;
  undefined4 uStack_a4c;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined4 local_9f8;
  undefined4 uStack_9f4;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined4 local_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined4 local_8c8;
  undefined4 uStack_8c4;
  undefined4 uStack_8c0;
  undefined4 uStack_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined4 local_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined1 local_7f8 [8];
  undefined8 uStack_7f0;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [16];
  undefined1 local_7b8 [8];
  undefined8 uStack_7b0;
  undefined1 local_7a8 [16];
  undefined4 local_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined1 local_788 [16];
  undefined1 local_778 [8];
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined4 local_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined4 local_728;
  undefined4 uStack_724;
  undefined4 uStack_720;
  undefined4 uStack_71c;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined4 local_708;
  undefined4 uStack_704;
  undefined4 uStack_700;
  undefined4 uStack_6fc;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined4 local_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined4 local_6a8;
  undefined4 uStack_6a4;
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined4 local_678;
  undefined4 uStack_674;
  undefined4 uStack_670;
  undefined4 uStack_66c;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined4 local_648;
  undefined4 uStack_644;
  undefined4 uStack_640;
  undefined4 uStack_63c;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined4 local_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined4 local_5e8;
  undefined4 uStack_5e4;
  undefined4 uStack_5e0;
  undefined4 uStack_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [16];
  undefined4 local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined1 (*local_c0) [16];
  undefined4 local_b4;
  int local_b0;
  int local_ac;
  undefined8 *local_a8;
  long local_a0;
  undefined4 local_94;
  long local_90;
  long local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  undefined8 *local_70;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined8 *local_50;
  undefined4 local_44;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_25bc = *(int *)((long)in_RDI + 0x2c);
  local_25c0 = (int)in_RDI[7];
  local_25c4 = *(int *)((long)in_RSI + 0x2c);
  local_25c8 = (int)in_RSI[6];
  local_25cc = (int)in_RSI[7];
  local_25d0 = in_R8D * in_R9D;
  local_25b8 = in_R9D;
  local_25b4 = in_R8D;
  local_25b0 = in_RCX;
  local_25a8 = in_RDX;
  local_25a0 = in_RSI;
  local_2598 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x3a9d71);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffd428._8_8_,in_stack_ffffffffffffd428._0_8_,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffd424,in_stack_ffffffffffffd420));
  std::allocator<int>::~allocator((allocator<int> *)0x3a9d9d);
  local_2608 = std::vector<int,_std::allocator<int>_>::operator[](&local_25e8,0);
  local_260c = 0;
  local_2610 = 0;
  local_2614 = local_25bc * in_stack_00000010 - local_25b4 * in_stack_00000008;
  for (local_2618 = 0; local_2618 < local_25b8; local_2618 = local_2618 + 1) {
    for (local_261c = 0; local_261c < local_25b4; local_261c = local_261c + 1) {
      local_2608[local_260c] = local_2610;
      local_260c = local_260c + 1;
      local_2610 = in_stack_00000008 + local_2610;
    }
    local_2610 = local_2614 + local_2610;
  }
  local_24c0 = local_25b0;
  local_2628 = *local_25b0;
  for (local_262c = 0; local_262c < local_25cc; local_262c = local_262c + 1) {
    local_24f0 = &local_2680;
    local_3c = *(int *)((long)local_25a0 + 0x2c);
    local_40 = (int)local_25a0[6];
    local_44 = *(undefined4 *)((long)local_25a0 + 0x34);
    local_50 = (undefined8 *)(*local_25a0 + local_25a0[8] * (long)local_262c * local_25a0[2]);
    local_58 = local_25a0[2];
    local_5c = (undefined4)local_25a0[3];
    local_68 = local_25a0[4];
    local_38 = &local_2680;
    local_28 = (long)local_3c * (long)local_40 * local_58;
    local_24d0 = &local_2680;
    local_2590 = &local_2680;
    local_2c = 0x10;
    local_24fc = local_262c;
    local_24fd = 1;
    local_2680 = 0;
    local_2670 = 0;
    local_2668 = 0;
    local_2658 = 0;
    local_2654 = 0;
    local_2650 = 0;
    local_264c = 0;
    local_2648 = 0;
    local_2640 = 0;
    local_2678 = 0;
    local_2638 = local_50;
    for (local_2684 = 0; local_2684 < local_25c8; local_2684 = local_2684 + 1) {
      for (local_2688 = 0; auVar2 = _local_19d8, uVar107 = local_1a28, local_2688 < local_25c4;
          local_2688 = local_2688 + 1) {
        local_2698 = ZEXT816(0);
        if (local_2628 != 0) {
          local_2380 = (undefined1 (*) [16])(local_2628 + (long)(local_262c << 2) * 4);
          local_2698 = *local_2380;
        }
        local_2468 = &local_26e8;
        local_ac = *(int *)((long)local_25a8 + 0x2c);
        local_b0 = (int)local_25a8[6];
        local_b4 = *(undefined4 *)((long)local_25a8 + 0x34);
        local_c0 = (undefined1 (*) [16])
                   (*local_25a8 + local_25a8[8] * (long)local_262c * local_25a8[2]);
        local_c8 = local_25a8[2];
        local_cc = (undefined4)local_25a8[3];
        local_d8 = local_25a8[4];
        local_a8 = &local_26e8;
        local_8 = (long)local_ac * (long)local_b0 * local_c8;
        local_24c8 = &local_26e8;
        local_2580 = &local_26e8;
        local_c = 0x10;
        local_2078 = (undefined1  [16])0x0;
        local_2474 = local_262c;
        local_2475 = 1;
        local_26e8 = 0;
        local_26d8 = 0;
        local_26d0 = 0;
        local_26c0 = 0;
        local_26bc = 0;
        local_26b8 = 0;
        local_26b4 = 0;
        local_26b0 = 0;
        local_26a8 = 0;
        local_26e0 = 0;
        local_26a0 = local_c0;
        for (local_26ec = 0; local_26ec < local_25c0; local_26ec = local_26ec + 1) {
          local_2498 = &local_2738;
          local_74 = *(int *)((long)local_2598 + 0x2c);
          local_78 = (int)local_2598[6];
          local_7c = *(undefined4 *)((long)local_2598 + 0x34);
          local_88 = *local_2598 + local_2598[8] * (long)local_26ec * local_2598[2];
          local_90 = local_2598[2];
          local_94 = (undefined4)local_2598[3];
          local_a0 = local_2598[4];
          local_70 = &local_2738;
          local_18 = (long)local_74 * (long)local_78 * local_90;
          local_24b4 = local_2684 * in_stack_00000020;
          local_24b0 = &local_2738;
          for (local_2744 = 0; local_2744 < local_25d0; local_2744 = local_2744 + 1) {
            local_1e70 = (undefined4 *)
                         (local_88 + (long)local_74 * (long)local_24b4 * local_90 +
                          (long)(local_2688 * in_stack_00000018 * 0x10) * 4 +
                         (long)(local_2608[local_2744] << 4) * 4);
            local_1e88 = *local_1e70;
            local_2088 = CONCAT44(local_1e88,local_1e88);
            uStack_2080 = CONCAT44(local_1e88,local_1e88);
            local_1e90 = local_1e70 + 1;
            local_1ea8 = *local_1e90;
            local_20b8 = CONCAT44(local_1ea8,local_1ea8);
            uStack_20b0 = CONCAT44(local_1ea8,local_1ea8);
            local_1eb0 = local_1e70 + 2;
            local_1ec8 = *local_1eb0;
            local_20e8 = CONCAT44(local_1ec8,local_1ec8);
            uStack_20e0 = CONCAT44(local_1ec8,local_1ec8);
            local_1ed0 = local_1e70 + 3;
            local_1ee8 = *local_1ed0;
            local_2118 = CONCAT44(local_1ee8,local_1ee8);
            uStack_2110 = CONCAT44(local_1ee8,local_1ee8);
            local_1ef0 = local_1e70 + 4;
            local_1f08 = *local_1ef0;
            local_2148 = CONCAT44(local_1f08,local_1f08);
            uStack_2140 = CONCAT44(local_1f08,local_1f08);
            local_1f10 = local_1e70 + 5;
            local_1f28 = *local_1f10;
            local_2178 = CONCAT44(local_1f28,local_1f28);
            uStack_2170 = CONCAT44(local_1f28,local_1f28);
            local_1f30 = local_1e70 + 6;
            local_1f48 = *local_1f30;
            local_21a8 = CONCAT44(local_1f48,local_1f48);
            uStack_21a0 = CONCAT44(local_1f48,local_1f48);
            local_1f50 = local_1e70 + 7;
            local_1f68 = *local_1f50;
            local_21d8 = CONCAT44(local_1f68,local_1f68);
            uStack_21d0 = CONCAT44(local_1f68,local_1f68);
            local_1f70 = local_1e70 + 8;
            local_1f88 = *local_1f70;
            local_2208 = CONCAT44(local_1f88,local_1f88);
            uStack_2200 = CONCAT44(local_1f88,local_1f88);
            local_1f90 = local_1e70 + 9;
            local_1fa8 = *local_1f90;
            local_2238 = CONCAT44(local_1fa8,local_1fa8);
            uStack_2230 = CONCAT44(local_1fa8,local_1fa8);
            local_1fb0 = local_1e70 + 10;
            local_1fc8 = *local_1fb0;
            local_2268 = CONCAT44(local_1fc8,local_1fc8);
            uStack_2260 = CONCAT44(local_1fc8,local_1fc8);
            local_1fd0 = local_1e70 + 0xb;
            local_1fe8 = *local_1fd0;
            local_2298 = CONCAT44(local_1fe8,local_1fe8);
            uStack_2290 = CONCAT44(local_1fe8,local_1fe8);
            local_1ff0 = local_1e70 + 0xc;
            local_2008 = *local_1ff0;
            local_22c8 = CONCAT44(local_2008,local_2008);
            uStack_22c0 = CONCAT44(local_2008,local_2008);
            local_2010 = local_1e70 + 0xd;
            local_2028 = *local_2010;
            local_22f8 = CONCAT44(local_2028,local_2028);
            uStack_22f0 = CONCAT44(local_2028,local_2028);
            local_2030 = local_1e70 + 0xe;
            local_2048 = *local_2030;
            local_2328 = CONCAT44(local_2048,local_2048);
            uStack_2320 = CONCAT44(local_2048,local_2048);
            local_2050 = local_1e70 + 0xf;
            local_2068 = *local_2050;
            local_2358 = CONCAT44(local_2068,local_2068);
            uStack_2350 = CONCAT44(local_2068,local_2068);
            local_2388 = local_26a0;
            local_2098 = *(undefined8 *)*local_26a0;
            uStack_2090 = *(undefined8 *)(*local_26a0 + 8);
            local_2390 = local_26a0 + 1;
            local_20c8 = *(undefined8 *)*local_2390;
            uStack_20c0 = *(undefined8 *)(local_26a0[1] + 8);
            local_2398 = local_26a0 + 2;
            local_20f8 = *(undefined8 *)*local_2398;
            uStack_20f0 = *(undefined8 *)(local_26a0[2] + 8);
            local_23a0 = local_26a0 + 3;
            local_2128 = *(undefined8 *)*local_23a0;
            uStack_2120 = *(undefined8 *)(local_26a0[3] + 8);
            local_23a8 = local_26a0 + 4;
            local_2158 = *(undefined8 *)*local_23a8;
            uStack_2150 = *(undefined8 *)(local_26a0[4] + 8);
            local_23b0 = local_26a0 + 5;
            local_2188 = *(undefined8 *)*local_23b0;
            uStack_2180 = *(undefined8 *)(local_26a0[5] + 8);
            local_23b8 = local_26a0 + 6;
            local_21b8 = *(undefined8 *)*local_23b8;
            uStack_21b0 = *(undefined8 *)(local_26a0[6] + 8);
            local_23c0 = local_26a0 + 7;
            local_21e8 = *(undefined8 *)*local_23c0;
            uStack_21e0 = *(undefined8 *)(local_26a0[7] + 8);
            local_23c8 = local_26a0 + 8;
            local_2218 = *(undefined8 *)*local_23c8;
            uStack_2210 = *(undefined8 *)(local_26a0[8] + 8);
            local_23d0 = local_26a0 + 9;
            local_2248 = *(undefined8 *)*local_23d0;
            uStack_2240 = *(undefined8 *)(local_26a0[9] + 8);
            local_23d8 = local_26a0 + 10;
            local_2278 = *(undefined8 *)*local_23d8;
            uStack_2270 = *(undefined8 *)(local_26a0[10] + 8);
            local_23e0 = local_26a0 + 0xb;
            local_22a8 = *(undefined8 *)*local_23e0;
            uStack_22a0 = *(undefined8 *)(local_26a0[0xb] + 8);
            local_23e8 = local_26a0 + 0xc;
            local_22d8 = *(undefined8 *)*local_23e8;
            uStack_22d0 = *(undefined8 *)(local_26a0[0xc] + 8);
            local_23f0 = local_26a0 + 0xd;
            local_2308 = *(undefined8 *)*local_23f0;
            uStack_2300 = *(undefined8 *)(local_26a0[0xd] + 8);
            local_23f8 = local_26a0 + 0xe;
            local_2338 = *(undefined8 *)*local_23f8;
            uStack_2330 = *(undefined8 *)(local_26a0[0xe] + 8);
            local_2400 = local_26a0 + 0xf;
            local_2368 = *(undefined8 *)*local_2400;
            uStack_2360 = *(undefined8 *)(local_26a0[0xf] + 8);
            local_20a8 = local_2698._0_8_;
            uStack_20a0 = local_2698._8_8_;
            auVar3._8_8_ = uStack_2080;
            auVar3._0_8_ = local_2088;
            auVar3 = vfmadd213ps_fma(*local_26a0,auVar3,local_2698);
            local_2698._0_8_ = auVar3._0_8_;
            local_20d8 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_20d0 = local_2698._8_8_;
            auVar17._8_8_ = uStack_20b0;
            auVar17._0_8_ = local_20b8;
            auVar3 = vfmadd213ps_fma(*local_2390,auVar17,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_2108 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_2100 = local_2698._8_8_;
            auVar16._8_8_ = uStack_20e0;
            auVar16._0_8_ = local_20e8;
            auVar3 = vfmadd213ps_fma(*local_2398,auVar16,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_2138 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_2130 = local_2698._8_8_;
            auVar15._8_8_ = uStack_2110;
            auVar15._0_8_ = local_2118;
            auVar3 = vfmadd213ps_fma(*local_23a0,auVar15,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_2168 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_2160 = local_2698._8_8_;
            auVar14._8_8_ = uStack_2140;
            auVar14._0_8_ = local_2148;
            auVar3 = vfmadd213ps_fma(*local_23a8,auVar14,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_2198 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_2190 = local_2698._8_8_;
            auVar13._8_8_ = uStack_2170;
            auVar13._0_8_ = local_2178;
            auVar3 = vfmadd213ps_fma(*local_23b0,auVar13,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_21c8 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_21c0 = local_2698._8_8_;
            auVar12._8_8_ = uStack_21a0;
            auVar12._0_8_ = local_21a8;
            auVar3 = vfmadd213ps_fma(*local_23b8,auVar12,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_21f8 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_21f0 = local_2698._8_8_;
            auVar11._8_8_ = uStack_21d0;
            auVar11._0_8_ = local_21d8;
            auVar3 = vfmadd213ps_fma(*local_23c0,auVar11,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_2228 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_2220 = local_2698._8_8_;
            auVar10._8_8_ = uStack_2200;
            auVar10._0_8_ = local_2208;
            auVar3 = vfmadd213ps_fma(*local_23c8,auVar10,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_2258 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_2250 = local_2698._8_8_;
            auVar9._8_8_ = uStack_2230;
            auVar9._0_8_ = local_2238;
            auVar3 = vfmadd213ps_fma(*local_23d0,auVar9,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_2288 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_2280 = local_2698._8_8_;
            auVar8._8_8_ = uStack_2260;
            auVar8._0_8_ = local_2268;
            auVar3 = vfmadd213ps_fma(*local_23d8,auVar8,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_22b8 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_22b0 = local_2698._8_8_;
            auVar7._8_8_ = uStack_2290;
            auVar7._0_8_ = local_2298;
            auVar3 = vfmadd213ps_fma(*local_23e0,auVar7,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_22e8 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_22e0 = local_2698._8_8_;
            auVar6._8_8_ = uStack_22c0;
            auVar6._0_8_ = local_22c8;
            auVar3 = vfmadd213ps_fma(*local_23e8,auVar6,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_2318 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_2310 = local_2698._8_8_;
            auVar5._8_8_ = uStack_22f0;
            auVar5._0_8_ = local_22f8;
            auVar3 = vfmadd213ps_fma(*local_23f0,auVar5,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_2348 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_2340 = local_2698._8_8_;
            auVar4._8_8_ = uStack_2320;
            auVar4._0_8_ = local_2328;
            auVar3 = vfmadd213ps_fma(*local_23f8,auVar4,auVar3);
            local_2698._0_8_ = auVar3._0_8_;
            local_2378 = local_2698._0_8_;
            local_2698._8_8_ = auVar3._8_8_;
            uStack_2370 = local_2698._8_8_;
            auVar1._8_8_ = uStack_2350;
            auVar1._0_8_ = local_2358;
            local_2698 = vfmadd213ps_fma(*local_2400,auVar1,auVar3);
            local_26a0 = local_26a0 + 0x10;
            uStack_2064 = local_2068;
            uStack_2060 = local_2068;
            uStack_205c = local_2068;
            local_2054 = local_2068;
            uStack_2044 = local_2048;
            uStack_2040 = local_2048;
            uStack_203c = local_2048;
            local_2034 = local_2048;
            uStack_2024 = local_2028;
            uStack_2020 = local_2028;
            uStack_201c = local_2028;
            local_2014 = local_2028;
            uStack_2004 = local_2008;
            uStack_2000 = local_2008;
            uStack_1ffc = local_2008;
            local_1ff4 = local_2008;
            uStack_1fe4 = local_1fe8;
            uStack_1fe0 = local_1fe8;
            uStack_1fdc = local_1fe8;
            local_1fd4 = local_1fe8;
            uStack_1fc4 = local_1fc8;
            uStack_1fc0 = local_1fc8;
            uStack_1fbc = local_1fc8;
            local_1fb4 = local_1fc8;
            uStack_1fa4 = local_1fa8;
            uStack_1fa0 = local_1fa8;
            uStack_1f9c = local_1fa8;
            local_1f94 = local_1fa8;
            uStack_1f84 = local_1f88;
            uStack_1f80 = local_1f88;
            uStack_1f7c = local_1f88;
            local_1f74 = local_1f88;
            uStack_1f64 = local_1f68;
            uStack_1f60 = local_1f68;
            uStack_1f5c = local_1f68;
            local_1f54 = local_1f68;
            uStack_1f44 = local_1f48;
            uStack_1f40 = local_1f48;
            uStack_1f3c = local_1f48;
            local_1f34 = local_1f48;
            uStack_1f24 = local_1f28;
            uStack_1f20 = local_1f28;
            uStack_1f1c = local_1f28;
            local_1f14 = local_1f28;
            uStack_1f04 = local_1f08;
            uStack_1f00 = local_1f08;
            uStack_1efc = local_1f08;
            local_1ef4 = local_1f08;
            uStack_1ee4 = local_1ee8;
            uStack_1ee0 = local_1ee8;
            uStack_1edc = local_1ee8;
            local_1ed4 = local_1ee8;
            uStack_1ec4 = local_1ec8;
            uStack_1ec0 = local_1ec8;
            uStack_1ebc = local_1ec8;
            local_1eb4 = local_1ec8;
            uStack_1ea4 = local_1ea8;
            uStack_1ea0 = local_1ea8;
            uStack_1e9c = local_1ea8;
            local_1e94 = local_1ea8;
            uStack_1e84 = local_1e88;
            uStack_1e80 = local_1e88;
            uStack_1e7c = local_1e88;
            local_1e74 = local_1e88;
          }
          local_2570 = &local_2738;
          local_1c = 0x10;
          local_24a4 = local_26ec;
          local_24a5 = 1;
          local_2738 = 0;
          local_2728 = 0;
          local_2720 = 0;
          local_2710 = 0;
          local_270c = 0;
          local_2708 = 0;
          local_2704 = 0;
          local_2700 = 0;
          local_26f8 = 0;
          local_2730 = 0;
          local_2548 = local_2570;
          local_2718 = local_a0;
        }
        local_1e18 = local_2698._0_8_;
        uStack_1e10 = local_2698._8_8_;
        local_19d8._8_4_ = local_2698._8_4_;
        fStack_19cc = local_2698._12_4_;
        local_1a28._0_4_ = local_2698._0_4_;
        fVar139 = (float)local_1a28;
        local_1a28._4_4_ = local_2698._4_4_;
        fVar140 = local_1a28._4_4_;
        local_1a28 = uVar107;
        _local_19d8 = auVar2;
        switch(in_stack_00000028) {
        case 1:
          local_1da8 = (undefined1  [16])0x0;
          local_1d68 = local_2698._0_8_;
          uStack_1d60 = local_2698._8_8_;
          local_1d78 = 0;
          uStack_1d70 = 0;
          _local_1e08 = vmaxps_avx(local_2698,ZEXT816(0));
          break;
        case 2:
          local_1db0 = in_stack_00000030;
          local_1db8 = 0;
          local_1d0c = *(float *)*in_stack_00000030;
          local_1d08 = local_2698._0_8_;
          uStack_1d00 = local_2698._8_8_;
          local_1ce8 = (undefined1  [16])0x0;
          local_1cc8 = 0;
          uStack_1cc0 = 0;
          local_1cd8 = local_2698._0_8_;
          uStack_1cd0 = local_2698._8_8_;
          local_1d28 = vmaxps_avx(ZEXT816(0),local_2698);
          local_1cf8 = (undefined1  [16])0x0;
          local_1c08 = 0;
          uStack_1c00 = 0;
          local_1c18 = local_2698._0_8_;
          uStack_1c10 = local_2698._8_8_;
          local_1d38 = vminps_avx(ZEXT816(0),local_2698);
          local_19b8._4_4_ = local_1d0c;
          local_19b8._0_4_ = local_1d0c;
          local_19b8._8_4_ = local_1d0c;
          local_19b8._12_4_ = local_1d0c;
          local_19c8 = local_1d38._0_8_;
          uVar107 = local_19c8;
          uStack_19c0 = local_1d38._8_8_;
          uVar108 = uStack_19c0;
          local_19c8._0_4_ = local_1d38._0_4_;
          local_19c8._4_4_ = local_1d38._4_4_;
          uStack_19c0._0_4_ = local_1d38._8_4_;
          uStack_19c0._4_4_ = local_1d38._12_4_;
          local_1a48 = local_1d0c * (float)local_19c8;
          fStack_1a44 = local_1d0c * local_19c8._4_4_;
          fStack_1a40 = local_1d0c * (float)uStack_19c0;
          fStack_1a3c = local_1d0c * uStack_19c0._4_4_;
          local_1a38._0_4_ = local_1d28._0_4_;
          local_1a38._4_4_ = local_1d28._4_4_;
          fStack_1a30 = local_1d28._8_4_;
          fStack_1a2c = local_1d28._12_4_;
          local_1e08._4_4_ = (float)local_1a38._4_4_ + fStack_1a44;
          local_1e08._0_4_ = (float)local_1a38._0_4_ + local_1a48;
          uStack_1e00._4_4_ = fStack_1a2c + fStack_1a3c;
          uStack_1e00._0_4_ = fStack_1a30 + fStack_1a40;
          local_1cb8 = local_1d0c;
          fStack_1cb4 = local_1d0c;
          fStack_1cb0 = local_1d0c;
          fStack_1cac = local_1d0c;
          local_1c9c = local_1d0c;
          _local_1a38 = local_1d28;
          local_19c8 = uVar107;
          uStack_19c0 = uVar108;
          break;
        case 3:
          local_1dc0 = in_stack_00000030;
          local_1dc8 = 0;
          local_1c78 = *(undefined4 *)*in_stack_00000030;
          local_1e38 = CONCAT44(local_1c78,local_1c78);
          uStack_1e30 = CONCAT44(local_1c78,local_1c78);
          local_1dd0 = in_stack_00000030;
          local_1dd8 = 1;
          local_1c98 = *(undefined4 *)(*in_stack_00000030 + 4);
          local_1e48 = CONCAT44(local_1c98,local_1c98);
          uStack_1e40 = CONCAT44(local_1c98,local_1c98);
          local_1d48 = local_2698._0_8_;
          uStack_1d40 = local_2698._8_8_;
          auVar18._8_8_ = uStack_1e30;
          auVar18._0_8_ = local_1e38;
          local_1be8 = vmaxps_avx(local_2698,auVar18);
          auVar19._8_8_ = uStack_1e40;
          auVar19._0_8_ = local_1e48;
          _local_1e08 = vminps_avx(local_1be8,auVar19);
          local_1d58 = local_1e38;
          uStack_1d50 = uStack_1e30;
          uStack_1c94 = local_1c98;
          uStack_1c90 = local_1c98;
          uStack_1c8c = local_1c98;
          local_1c7c = local_1c98;
          uStack_1c74 = local_1c78;
          uStack_1c70 = local_1c78;
          uStack_1c6c = local_1c78;
          local_1c5c = local_1c78;
          local_1bf8 = local_1e48;
          uStack_1bf0 = uStack_1e40;
          break;
        case 4:
          local_1bc8 = local_2698._0_8_;
          uStack_1bc0 = local_2698._8_8_;
          local_1b8c = 0x3f800000;
          local_1ba8 = 0x3f800000;
          uStack_1ba4 = 0x3f800000;
          uStack_1ba0 = 0x3f800000;
          uStack_1b9c = 0x3f800000;
          local_1bd8 = 0x3f8000003f800000;
          uStack_1bd0 = 0x3f8000003f800000;
          local_1bb8 = (undefined1  [16])0x0;
          local_11d8 = 0;
          uStack_11d0 = 0;
          local_11e8 = local_2698._0_8_;
          uStack_11e0 = local_2698._8_8_;
          auVar2 = vsubps_avx(ZEXT816(0),local_2698);
          local_1318 = (undefined1  [16])0x0;
          local_15a8 = 0x3f800000;
          uStack_15a4 = 0x3f800000;
          uStack_15a0 = 0x3f800000;
          uStack_159c = 0x3f800000;
          local_1568._0_8_ = auVar2._0_8_;
          local_1568._8_8_ = auVar2._8_8_;
          local_12d8 = local_1568._0_8_;
          uStack_12d0 = local_1568._8_8_;
          local_12e8 = 0x42b0c0a5;
          uStack_12e4 = 0x42b0c0a5;
          uStack_12e0 = 0x42b0c0a5;
          uStack_12dc = 0x42b0c0a5;
          auVar39._8_4_ = 0x42b0c0a5;
          auVar39._0_8_ = 0x42b0c0a542b0c0a5;
          auVar39._12_4_ = 0x42b0c0a5;
          auVar2 = vminps_avx(auVar2,auVar39);
          local_1568._0_8_ = auVar2._0_8_;
          local_1568._8_8_ = auVar2._8_8_;
          local_12f8 = local_1568._0_8_;
          uStack_12f0 = local_1568._8_8_;
          local_1308 = 0xc2b0c0a5;
          uStack_1304 = 0xc2b0c0a5;
          uStack_1300 = 0xc2b0c0a5;
          uStack_12fc = 0xc2b0c0a5;
          auVar38._8_4_ = 0xc2b0c0a5;
          auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar38._12_4_ = 0xc2b0c0a5;
          auVar1 = vmaxps_avx(auVar2,auVar38);
          local_1568._0_8_ = auVar1._0_8_;
          local_1568._8_8_ = auVar1._8_8_;
          local_1238 = local_1568._0_8_;
          uVar113 = local_1238;
          uStack_1230 = local_1568._8_8_;
          uVar114 = uStack_1230;
          local_1248 = 0x3fb8aa3b;
          uStack_1244 = 0x3fb8aa3b;
          uStack_1240 = 0x3fb8aa3b;
          uStack_123c = 0x3fb8aa3b;
          local_1238._0_4_ = auVar1._0_4_;
          local_1238._4_4_ = auVar1._4_4_;
          uStack_1230._0_4_ = auVar1._8_4_;
          uStack_1230._4_4_ = auVar1._12_4_;
          local_1588._4_4_ = local_1238._4_4_ * 1.442695;
          local_1588._0_4_ = (float)local_1238 * 1.442695;
          uStack_1580._0_4_ = (float)uStack_1230 * 1.442695;
          uStack_1580._4_4_ = uStack_1230._4_4_ * 1.442695;
          local_1298 = local_1588;
          uStack_1290 = uStack_1580;
          local_12a8 = 0x3f000000;
          uStack_12a4 = 0x3f000000;
          uStack_12a0 = 0x3f000000;
          uStack_129c = 0x3f000000;
          local_1588._0_4_ = (float)local_1238 * 1.442695 + 0.5;
          local_1588._4_4_ = local_1238._4_4_ * 1.442695 + 0.5;
          fVar139 = (float)uStack_1230 * 1.442695 + 0.5;
          fVar140 = uStack_1230._4_4_ * 1.442695 + 0.5;
          uStack_1580._0_4_ = fVar139;
          uStack_1580._4_4_ = fVar140;
          local_11b8 = local_1588;
          uStack_11b0 = uStack_1580;
          local_1598._4_4_ = (int)(float)local_1588._4_4_;
          local_1598._0_4_ = (int)(float)local_1588._0_4_;
          local_1598._8_4_ = (int)fVar139;
          local_1598._12_4_ = (int)fVar140;
          local_1188 = local_1598._0_8_;
          uStack_1180 = local_1598._8_8_;
          auVar40._8_8_ = local_1598._8_8_;
          auVar40._0_8_ = local_1598._0_8_;
          auVar3 = vcvtdq2ps_avx(auVar40);
          local_1578 = auVar3._0_8_;
          uStack_1570 = auVar3._8_8_;
          local_1158 = local_1578;
          uStack_1150 = uStack_1570;
          local_1168 = local_1588;
          uStack_1160 = uStack_1580;
          auVar42._8_8_ = uStack_1580;
          auVar42._0_8_ = local_1588;
          auVar2 = vcmpps_avx(auVar42,auVar3,1);
          local_15b8._0_8_ = auVar2._0_8_;
          local_15b8._8_8_ = auVar2._8_8_;
          local_1128 = 0x3f8000003f800000;
          uStack_1120 = 0x3f8000003f800000;
          local_1118 = local_15b8._0_8_;
          uStack_1110 = local_15b8._8_8_;
          auVar44._8_8_ = 0x3f8000003f800000;
          auVar44._0_8_ = 0x3f8000003f800000;
          local_15b8 = vpand_avx(auVar2,auVar44);
          local_1218 = local_1578;
          uStack_1210 = uStack_1570;
          local_1228 = local_15b8._0_8_;
          uStack_1220 = local_15b8._8_8_;
          _local_1588 = vsubps_avx(auVar3,local_15b8);
          local_1098 = local_1588;
          uStack_1090 = uStack_1580;
          local_10a8 = 0x3f318000;
          uStack_10a4 = 0x3f318000;
          uStack_10a0 = 0x3f318000;
          uStack_109c = 0x3f318000;
          local_10b8 = local_1568._0_8_;
          uStack_10b0 = local_1568._8_8_;
          local_f18 = 0x3f3180003f318000;
          uStack_f10 = 0x3f3180003f318000;
          local_f08 = local_1588;
          uStack_f00 = uStack_1580;
          local_f28 = local_1568._0_8_;
          uStack_f20 = local_1568._8_8_;
          auVar141._8_4_ = 0x80000000;
          auVar141._0_8_ = 0x8000000080000000;
          auVar141._12_4_ = 0x80000000;
          auVar52._8_8_ = 0x3f3180003f318000;
          auVar52._0_8_ = 0x3f3180003f318000;
          auVar2 = vfmadd213ps_fma(auVar52,_local_1588 ^ auVar141,auVar1);
          local_2b28 = auVar2._0_8_;
          uStack_2b20 = auVar2._8_8_;
          local_10c8 = local_1588;
          uStack_10c0 = uStack_1580;
          local_10d8 = 0xb95e8083;
          uStack_10d4 = 0xb95e8083;
          uStack_10d0 = 0xb95e8083;
          uStack_10cc = 0xb95e8083;
          local_10e8 = local_2b28;
          uStack_10e0 = uStack_2b20;
          local_ee8 = 0xb95e8083b95e8083;
          uStack_ee0 = 0xb95e8083b95e8083;
          local_ed8 = local_1588;
          uStack_ed0 = uStack_1580;
          local_ef8 = local_2b28;
          uStack_ef0 = uStack_2b20;
          auVar142._8_4_ = 0x80000000;
          auVar142._0_8_ = 0x8000000080000000;
          auVar142._12_4_ = 0x80000000;
          auVar53._8_8_ = 0xb95e8083b95e8083;
          auVar53._0_8_ = 0xb95e8083b95e8083;
          local_1568 = vfmadd213ps_fma(auVar53,_local_1588 ^ auVar142,auVar2);
          local_2b58 = local_1568._0_8_;
          uStack_2b50 = local_1568._8_8_;
          local_1258 = local_2b58;
          uVar111 = local_1258;
          uStack_1250 = uStack_2b50;
          uVar112 = uStack_1250;
          local_1268 = local_2b58;
          uStack_1260 = uStack_2b50;
          local_1258._0_4_ = local_1568._0_4_;
          local_1258._4_4_ = local_1568._4_4_;
          uStack_1250._0_4_ = local_1568._8_4_;
          uStack_1250._4_4_ = local_1568._12_4_;
          local_1578 = CONCAT44(local_1258._4_4_ * local_1258._4_4_,
                                (float)local_1258 * (float)local_1258);
          uStack_1570._0_4_ = (float)uStack_1250 * (float)uStack_1250;
          uStack_1570._4_4_ = uStack_1250._4_4_ * uStack_1250._4_4_;
          uStack_15c0._0_4_ = 0x39506967;
          local_15c8 = 0x3950696739506967;
          uStack_15c0._4_4_ = 0x39506967;
          local_1448 = 0x3950696739506967;
          uStack_1440 = uStack_15c0;
          local_1458 = local_2b58;
          uStack_1450 = uStack_2b50;
          local_1468 = 0x3ab743ce;
          uStack_1464 = 0x3ab743ce;
          uStack_1460 = 0x3ab743ce;
          uStack_145c = 0x3ab743ce;
          local_1438 = 0x3ab743ce3ab743ce;
          uStack_1430 = 0x3ab743ce3ab743ce;
          local_1418 = 0x3950696739506967;
          uStack_1410 = uStack_15c0;
          local_1428 = local_2b58;
          uStack_1420 = uStack_2b50;
          auVar32._8_8_ = uStack_15c0;
          auVar32._0_8_ = 0x3950696739506967;
          auVar31._8_8_ = 0x3ab743ce3ab743ce;
          auVar31._0_8_ = 0x3ab743ce3ab743ce;
          auVar2 = vfmadd213ps_fma(local_1568,auVar32,auVar31);
          local_15c8 = auVar2._0_8_;
          uStack_15c0 = auVar2._8_8_;
          local_1478 = local_15c8;
          uStack_1470 = uStack_15c0;
          local_1488 = local_2b58;
          uStack_1480 = uStack_2b50;
          local_1498 = 0x3c088908;
          uStack_1494 = 0x3c088908;
          uStack_1490 = 0x3c088908;
          uStack_148c = 0x3c088908;
          local_1408 = 0x3c0889083c088908;
          uStack_1400 = 0x3c0889083c088908;
          local_13e8 = local_15c8;
          uStack_13e0 = uStack_15c0;
          local_13f8 = local_2b58;
          uStack_13f0 = uStack_2b50;
          auVar33._8_8_ = 0x3c0889083c088908;
          auVar33._0_8_ = 0x3c0889083c088908;
          auVar2 = vfmadd213ps_fma(local_1568,auVar2,auVar33);
          local_15c8 = auVar2._0_8_;
          uStack_15c0 = auVar2._8_8_;
          local_14a8 = local_15c8;
          uStack_14a0 = uStack_15c0;
          local_14b8 = local_2b58;
          uStack_14b0 = uStack_2b50;
          local_14c8 = 0x3d2aa9c1;
          uStack_14c4 = 0x3d2aa9c1;
          uStack_14c0 = 0x3d2aa9c1;
          uStack_14bc = 0x3d2aa9c1;
          local_13d8 = 0x3d2aa9c13d2aa9c1;
          uStack_13d0 = 0x3d2aa9c13d2aa9c1;
          local_13b8 = local_15c8;
          uStack_13b0 = uStack_15c0;
          local_13c8 = local_2b58;
          uStack_13c0 = uStack_2b50;
          auVar34._8_8_ = 0x3d2aa9c13d2aa9c1;
          auVar34._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar2 = vfmadd213ps_fma(local_1568,auVar2,auVar34);
          local_15c8 = auVar2._0_8_;
          uStack_15c0 = auVar2._8_8_;
          local_14d8 = local_15c8;
          uStack_14d0 = uStack_15c0;
          local_14e8 = local_2b58;
          uStack_14e0 = uStack_2b50;
          local_14f8 = 0x3e2aaaaa;
          uStack_14f4 = 0x3e2aaaaa;
          uStack_14f0 = 0x3e2aaaaa;
          uStack_14ec = 0x3e2aaaaa;
          local_13a8 = 0x3e2aaaaa3e2aaaaa;
          uStack_13a0 = 0x3e2aaaaa3e2aaaaa;
          local_1388 = local_15c8;
          uStack_1380 = uStack_15c0;
          local_1398 = local_2b58;
          uStack_1390 = uStack_2b50;
          auVar35._8_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar35._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar2 = vfmadd213ps_fma(local_1568,auVar2,auVar35);
          local_15c8 = auVar2._0_8_;
          uStack_15c0 = auVar2._8_8_;
          local_1508 = local_15c8;
          uStack_1500 = uStack_15c0;
          local_1518 = local_2b58;
          uStack_1510 = uStack_2b50;
          local_1528 = 0x3f000000;
          uStack_1524 = 0x3f000000;
          uStack_1520 = 0x3f000000;
          uStack_151c = 0x3f000000;
          local_1378 = 0x3f0000003f000000;
          uStack_1370 = 0x3f0000003f000000;
          local_1358 = local_15c8;
          uStack_1350 = uStack_15c0;
          local_1368 = local_2b58;
          uStack_1360 = uStack_2b50;
          auVar36._8_8_ = 0x3f0000003f000000;
          auVar36._0_8_ = 0x3f0000003f000000;
          auVar2 = vfmadd213ps_fma(local_1568,auVar2,auVar36);
          local_15c8 = auVar2._0_8_;
          uStack_15c0 = auVar2._8_8_;
          local_1538 = local_15c8;
          uStack_1530 = uStack_15c0;
          local_1548 = local_1578;
          uStack_1540 = uStack_1570;
          local_1558 = local_2b58;
          uStack_1550 = uStack_2b50;
          local_1328 = local_15c8;
          uStack_1320 = uStack_15c0;
          local_1338 = local_1578;
          uStack_1330 = uStack_1570;
          local_1348 = local_2b58;
          uStack_1340 = uStack_2b50;
          auVar37._8_8_ = uStack_1570;
          auVar37._0_8_ = local_1578;
          auVar2 = vfmadd213ps_fma(auVar37,auVar2,local_1568);
          local_15c8 = auVar2._0_8_;
          uStack_15c0 = auVar2._8_8_;
          local_12c8 = 0x3f8000003f800000;
          uStack_12c0 = 0x3f8000003f800000;
          local_12b8 = local_15c8;
          uVar107 = local_12b8;
          uStack_12b0 = uStack_15c0;
          uVar108 = uStack_12b0;
          local_12b8._0_4_ = auVar2._0_4_;
          local_12b8._4_4_ = auVar2._4_4_;
          uStack_12b0._0_4_ = auVar2._8_4_;
          uStack_12b0._4_4_ = auVar2._12_4_;
          local_15c8 = CONCAT44(local_12b8._4_4_ + 1.0,(float)local_12b8 + 1.0);
          uStack_15c0._0_4_ = (float)uStack_12b0 + 1.0;
          uStack_15c0._4_4_ = uStack_12b0._4_4_ + 1.0;
          local_11c8 = local_1588;
          uVar115 = local_11c8;
          uStack_11c0 = uStack_1580;
          uVar116 = uStack_11c0;
          local_11c8._0_4_ = local_1588._0_4_;
          local_11c8._4_4_ = local_1588._4_4_;
          uStack_11c0._0_4_ = local_1588._8_4_;
          uStack_11c0._4_4_ = local_1588._12_4_;
          local_1598._4_4_ = (int)local_11c8._4_4_;
          local_1598._0_4_ = (int)(float)local_11c8;
          local_1598._8_4_ = (int)(float)uStack_11c0;
          local_1598._12_4_ = (int)uStack_11c0._4_4_;
          local_1018 = local_1598._0_8_;
          uStack_1010 = local_1598._8_8_;
          local_1028 = 0x7f0000007f;
          uStack_1020 = 0x7f0000007f;
          auVar47._8_8_ = local_1598._8_8_;
          auVar47._0_8_ = local_1598._0_8_;
          auVar46._8_8_ = 0x7f0000007f;
          auVar46._0_8_ = 0x7f0000007f;
          auVar2 = vpaddd_avx(auVar47,auVar46);
          local_1598._0_8_ = auVar2._0_8_;
          local_1598._8_8_ = auVar2._8_8_;
          local_fd8 = local_1598._0_8_;
          uStack_fd0 = local_1598._8_8_;
          local_fdc = 0x17;
          local_1598 = vpslld_avx(auVar2,ZEXT416(0x17));
          local_fa8 = local_1598._0_8_;
          uStack_fa0 = local_1598._8_8_;
          local_15d8 = local_1598._0_8_;
          uStack_15d0 = local_1598._8_8_;
          local_1278 = local_15c8;
          uStack_1270 = uStack_15c0;
          local_1288 = local_1598._0_8_;
          uVar109 = local_1288;
          uStack_1280 = local_1598._8_8_;
          uVar110 = uStack_1280;
          local_1288._0_4_ = local_1598._0_4_;
          local_1288._4_4_ = local_1598._4_4_;
          uStack_1280._0_4_ = local_1598._8_4_;
          uStack_1280._4_4_ = local_1598._12_4_;
          local_1288._0_4_ = ((float)local_12b8 + 1.0) * (float)local_1288;
          local_1288._4_4_ = (local_12b8._4_4_ + 1.0) * local_1288._4_4_;
          uStack_1280._0_4_ = ((float)uStack_12b0 + 1.0) * (float)uStack_1280;
          uStack_1280._4_4_ = (uStack_12b0._4_4_ + 1.0) * uStack_1280._4_4_;
          local_15c8 = CONCAT44(local_1288._4_4_,(float)local_1288);
          uStack_15c0._0_4_ = (float)uStack_1280;
          uStack_15c0._4_4_ = uStack_1280._4_4_;
          local_1998._8_8_ = 0x3f8000003f800000;
          local_1998._0_8_ = 0x3f8000003f800000;
          local_1a58._8_8_ = 0x3f8000003f800000;
          local_1a58._0_8_ = 0x3f8000003f800000;
          local_1a68 = local_15c8;
          uStack_1a60 = uStack_15c0;
          local_19a8 = (float)local_1288 + 1.0;
          fStack_19a4 = local_1288._4_4_ + 1.0;
          fStack_19a0 = (float)uStack_1280 + 1.0;
          fStack_199c = uStack_1280._4_4_ + 1.0;
          auVar21._4_4_ = fStack_19a4;
          auVar21._0_4_ = local_19a8;
          auVar21._8_4_ = fStack_19a0;
          auVar21._12_4_ = fStack_199c;
          _local_1e08 = vdivps_avx(local_1998,auVar21);
          local_12b8 = uVar107;
          uStack_12b0 = uVar108;
          local_1288 = uVar109;
          uStack_1280 = uVar110;
          local_1258 = uVar111;
          uStack_1250 = uVar112;
          local_1238 = uVar113;
          uStack_1230 = uVar114;
          local_11c8 = uVar115;
          uStack_11c0 = uVar116;
          break;
        case 5:
          local_1b88 = local_2698._0_8_;
          uStack_1b80 = local_2698._8_8_;
          local_16c8 = (undefined1  [16])0x0;
          local_1958 = 0x3f800000;
          uStack_1954 = 0x3f800000;
          uStack_1950 = 0x3f800000;
          uStack_194c = 0x3f800000;
          local_1688 = local_2698._0_8_;
          uStack_1680 = local_2698._8_8_;
          local_1698 = 0x42b0c0a5;
          uStack_1694 = 0x42b0c0a5;
          uStack_1690 = 0x42b0c0a5;
          uStack_168c = 0x42b0c0a5;
          auVar30._8_4_ = 0x42b0c0a5;
          auVar30._0_8_ = 0x42b0c0a542b0c0a5;
          auVar30._12_4_ = 0x42b0c0a5;
          auVar2 = vminps_avx(local_2698,auVar30);
          local_1918._0_8_ = auVar2._0_8_;
          local_1918._8_8_ = auVar2._8_8_;
          local_16a8 = local_1918._0_8_;
          uStack_16a0 = local_1918._8_8_;
          local_16b8 = 0xc2b0c0a5;
          uStack_16b4 = 0xc2b0c0a5;
          uStack_16b0 = 0xc2b0c0a5;
          uStack_16ac = 0xc2b0c0a5;
          auVar29._8_4_ = 0xc2b0c0a5;
          auVar29._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar29._12_4_ = 0xc2b0c0a5;
          auVar1 = vmaxps_avx(auVar2,auVar29);
          local_1918._0_8_ = auVar1._0_8_;
          local_1918._8_8_ = auVar1._8_8_;
          local_15e8 = local_1918._0_8_;
          uVar113 = local_15e8;
          uStack_15e0 = local_1918._8_8_;
          uVar114 = uStack_15e0;
          local_15f8 = 0x3fb8aa3b;
          uStack_15f4 = 0x3fb8aa3b;
          uStack_15f0 = 0x3fb8aa3b;
          uStack_15ec = 0x3fb8aa3b;
          local_15e8._0_4_ = auVar1._0_4_;
          local_15e8._4_4_ = auVar1._4_4_;
          uStack_15e0._0_4_ = auVar1._8_4_;
          uStack_15e0._4_4_ = auVar1._12_4_;
          local_1938._4_4_ = local_15e8._4_4_ * 1.442695;
          local_1938._0_4_ = (float)local_15e8 * 1.442695;
          uStack_1930._0_4_ = (float)uStack_15e0 * 1.442695;
          uStack_1930._4_4_ = uStack_15e0._4_4_ * 1.442695;
          local_1648 = local_1938;
          uStack_1640 = uStack_1930;
          local_1658 = 0x3f000000;
          uStack_1654 = 0x3f000000;
          uStack_1650 = 0x3f000000;
          uStack_164c = 0x3f000000;
          local_1938._0_4_ = (float)local_15e8 * 1.442695 + 0.5;
          local_1938._4_4_ = local_15e8._4_4_ * 1.442695 + 0.5;
          fVar139 = (float)uStack_15e0 * 1.442695 + 0.5;
          fVar140 = uStack_15e0._4_4_ * 1.442695 + 0.5;
          uStack_1930._0_4_ = fVar139;
          uStack_1930._4_4_ = fVar140;
          local_1198 = local_1938;
          uStack_1190 = uStack_1930;
          local_1948._4_4_ = (int)(float)local_1938._4_4_;
          local_1948._0_4_ = (int)(float)local_1938._0_4_;
          local_1948._8_4_ = (int)fVar139;
          local_1948._12_4_ = (int)fVar140;
          local_1178 = local_1948._0_8_;
          uStack_1170 = local_1948._8_8_;
          auVar41._8_8_ = local_1948._8_8_;
          auVar41._0_8_ = local_1948._0_8_;
          auVar3 = vcvtdq2ps_avx(auVar41);
          local_1928 = auVar3._0_8_;
          uStack_1920 = auVar3._8_8_;
          local_1138 = local_1928;
          uStack_1130 = uStack_1920;
          local_1148 = local_1938;
          uStack_1140 = uStack_1930;
          auVar43._8_8_ = uStack_1930;
          auVar43._0_8_ = local_1938;
          auVar2 = vcmpps_avx(auVar43,auVar3,1);
          local_1968._0_8_ = auVar2._0_8_;
          local_1968._8_8_ = auVar2._8_8_;
          local_1108 = 0x3f8000003f800000;
          uStack_1100 = 0x3f8000003f800000;
          local_10f8 = local_1968._0_8_;
          uStack_10f0 = local_1968._8_8_;
          auVar45._8_8_ = 0x3f8000003f800000;
          auVar45._0_8_ = 0x3f8000003f800000;
          local_1968 = vpand_avx(auVar2,auVar45);
          local_11f8 = local_1928;
          uStack_11f0 = uStack_1920;
          local_1208 = local_1968._0_8_;
          uStack_1200 = local_1968._8_8_;
          _local_1938 = vsubps_avx(auVar3,local_1968);
          local_1038 = local_1938;
          uStack_1030 = uStack_1930;
          local_1048 = 0x3f318000;
          uStack_1044 = 0x3f318000;
          uStack_1040 = 0x3f318000;
          uStack_103c = 0x3f318000;
          local_1058 = local_1918._0_8_;
          uStack_1050 = local_1918._8_8_;
          local_f78 = 0x3f3180003f318000;
          uStack_f70 = 0x3f3180003f318000;
          local_f68 = local_1938;
          uStack_f60 = uStack_1930;
          local_f88 = local_1918._0_8_;
          uStack_f80 = local_1918._8_8_;
          auVar143._8_4_ = 0x80000000;
          auVar143._0_8_ = 0x8000000080000000;
          auVar143._12_4_ = 0x80000000;
          auVar50._8_8_ = 0x3f3180003f318000;
          auVar50._0_8_ = 0x3f3180003f318000;
          auVar2 = vfmadd213ps_fma(auVar50,_local_1938 ^ auVar143,auVar1);
          local_2b88 = auVar2._0_8_;
          uStack_2b80 = auVar2._8_8_;
          local_1068 = local_1938;
          uStack_1060 = uStack_1930;
          local_1078 = 0xb95e8083;
          uStack_1074 = 0xb95e8083;
          uStack_1070 = 0xb95e8083;
          uStack_106c = 0xb95e8083;
          local_1088 = local_2b88;
          uStack_1080 = uStack_2b80;
          local_f48 = 0xb95e8083b95e8083;
          uStack_f40 = 0xb95e8083b95e8083;
          local_f38 = local_1938;
          uStack_f30 = uStack_1930;
          local_f58 = local_2b88;
          uStack_f50 = uStack_2b80;
          auVar144._8_4_ = 0x80000000;
          auVar144._0_8_ = 0x8000000080000000;
          auVar144._12_4_ = 0x80000000;
          auVar51._8_8_ = 0xb95e8083b95e8083;
          auVar51._0_8_ = 0xb95e8083b95e8083;
          local_1918 = vfmadd213ps_fma(auVar51,_local_1938 ^ auVar144,auVar2);
          local_2ba8 = local_1918._0_8_;
          uStack_2ba0 = local_1918._8_8_;
          local_1608 = local_2ba8;
          uVar111 = local_1608;
          uStack_1600 = uStack_2ba0;
          uVar112 = uStack_1600;
          local_1618 = local_2ba8;
          uStack_1610 = uStack_2ba0;
          local_1608._0_4_ = local_1918._0_4_;
          local_1608._4_4_ = local_1918._4_4_;
          uStack_1600._0_4_ = local_1918._8_4_;
          uStack_1600._4_4_ = local_1918._12_4_;
          local_1928 = CONCAT44(local_1608._4_4_ * local_1608._4_4_,
                                (float)local_1608 * (float)local_1608);
          uStack_1920._0_4_ = (float)uStack_1600 * (float)uStack_1600;
          uStack_1920._4_4_ = uStack_1600._4_4_ * uStack_1600._4_4_;
          uStack_1970._0_4_ = 0x39506967;
          local_1978 = 0x3950696739506967;
          uStack_1970._4_4_ = 0x39506967;
          local_17f8 = 0x3950696739506967;
          uStack_17f0 = uStack_1970;
          local_1808 = local_2ba8;
          uStack_1800 = uStack_2ba0;
          local_1818 = 0x3ab743ce;
          uStack_1814 = 0x3ab743ce;
          uStack_1810 = 0x3ab743ce;
          uStack_180c = 0x3ab743ce;
          local_17e8 = 0x3ab743ce3ab743ce;
          uStack_17e0 = 0x3ab743ce3ab743ce;
          local_17c8 = 0x3950696739506967;
          uStack_17c0 = uStack_1970;
          local_17d8 = local_2ba8;
          uStack_17d0 = uStack_2ba0;
          auVar23._8_8_ = uStack_1970;
          auVar23._0_8_ = 0x3950696739506967;
          auVar22._8_8_ = 0x3ab743ce3ab743ce;
          auVar22._0_8_ = 0x3ab743ce3ab743ce;
          auVar2 = vfmadd213ps_fma(local_1918,auVar23,auVar22);
          local_1978 = auVar2._0_8_;
          uStack_1970 = auVar2._8_8_;
          local_1828 = local_1978;
          uStack_1820 = uStack_1970;
          local_1838 = local_2ba8;
          uStack_1830 = uStack_2ba0;
          local_1848 = 0x3c088908;
          uStack_1844 = 0x3c088908;
          uStack_1840 = 0x3c088908;
          uStack_183c = 0x3c088908;
          local_17b8 = 0x3c0889083c088908;
          uStack_17b0 = 0x3c0889083c088908;
          local_1798 = local_1978;
          uStack_1790 = uStack_1970;
          local_17a8 = local_2ba8;
          uStack_17a0 = uStack_2ba0;
          auVar24._8_8_ = 0x3c0889083c088908;
          auVar24._0_8_ = 0x3c0889083c088908;
          auVar2 = vfmadd213ps_fma(local_1918,auVar2,auVar24);
          local_1978 = auVar2._0_8_;
          uStack_1970 = auVar2._8_8_;
          local_1858 = local_1978;
          uStack_1850 = uStack_1970;
          local_1868 = local_2ba8;
          uStack_1860 = uStack_2ba0;
          local_1878 = 0x3d2aa9c1;
          uStack_1874 = 0x3d2aa9c1;
          uStack_1870 = 0x3d2aa9c1;
          uStack_186c = 0x3d2aa9c1;
          local_1788 = 0x3d2aa9c13d2aa9c1;
          uStack_1780 = 0x3d2aa9c13d2aa9c1;
          local_1768 = local_1978;
          uStack_1760 = uStack_1970;
          local_1778 = local_2ba8;
          uStack_1770 = uStack_2ba0;
          auVar25._8_8_ = 0x3d2aa9c13d2aa9c1;
          auVar25._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar2 = vfmadd213ps_fma(local_1918,auVar2,auVar25);
          local_1978 = auVar2._0_8_;
          uStack_1970 = auVar2._8_8_;
          local_1888 = local_1978;
          uStack_1880 = uStack_1970;
          local_1898 = local_2ba8;
          uStack_1890 = uStack_2ba0;
          local_18a8 = 0x3e2aaaaa;
          uStack_18a4 = 0x3e2aaaaa;
          uStack_18a0 = 0x3e2aaaaa;
          uStack_189c = 0x3e2aaaaa;
          local_1758 = 0x3e2aaaaa3e2aaaaa;
          uStack_1750 = 0x3e2aaaaa3e2aaaaa;
          local_1738 = local_1978;
          uStack_1730 = uStack_1970;
          local_1748 = local_2ba8;
          uStack_1740 = uStack_2ba0;
          auVar26._8_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar26._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar2 = vfmadd213ps_fma(local_1918,auVar2,auVar26);
          local_1978 = auVar2._0_8_;
          uStack_1970 = auVar2._8_8_;
          local_18b8 = local_1978;
          uStack_18b0 = uStack_1970;
          local_18c8 = local_2ba8;
          uStack_18c0 = uStack_2ba0;
          local_18d8 = 0x3f000000;
          uStack_18d4 = 0x3f000000;
          uStack_18d0 = 0x3f000000;
          uStack_18cc = 0x3f000000;
          local_1728 = 0x3f0000003f000000;
          uStack_1720 = 0x3f0000003f000000;
          local_1708 = local_1978;
          uStack_1700 = uStack_1970;
          local_1718 = local_2ba8;
          uStack_1710 = uStack_2ba0;
          auVar27._8_8_ = 0x3f0000003f000000;
          auVar27._0_8_ = 0x3f0000003f000000;
          auVar2 = vfmadd213ps_fma(local_1918,auVar2,auVar27);
          local_1978 = auVar2._0_8_;
          uStack_1970 = auVar2._8_8_;
          local_18e8 = local_1978;
          uStack_18e0 = uStack_1970;
          local_18f8 = local_1928;
          uStack_18f0 = uStack_1920;
          local_1908 = local_2ba8;
          uStack_1900 = uStack_2ba0;
          local_16d8 = local_1978;
          uStack_16d0 = uStack_1970;
          local_16e8 = local_1928;
          uStack_16e0 = uStack_1920;
          local_16f8 = local_2ba8;
          uStack_16f0 = uStack_2ba0;
          auVar28._8_8_ = uStack_1920;
          auVar28._0_8_ = local_1928;
          auVar2 = vfmadd213ps_fma(auVar28,auVar2,local_1918);
          local_1978 = auVar2._0_8_;
          uStack_1970 = auVar2._8_8_;
          local_1678 = 0x3f8000003f800000;
          uStack_1670 = 0x3f8000003f800000;
          local_1668 = local_1978;
          uVar107 = local_1668;
          uStack_1660 = uStack_1970;
          uVar108 = uStack_1660;
          local_1668._0_4_ = auVar2._0_4_;
          local_1668._4_4_ = auVar2._4_4_;
          uStack_1660._0_4_ = auVar2._8_4_;
          uStack_1660._4_4_ = auVar2._12_4_;
          local_1978 = CONCAT44(local_1668._4_4_ + 1.0,(float)local_1668 + 1.0);
          uStack_1970._0_4_ = (float)uStack_1660 + 1.0;
          uStack_1970._4_4_ = uStack_1660._4_4_ + 1.0;
          local_11a8 = local_1938;
          uVar115 = local_11a8;
          uStack_11a0 = uStack_1930;
          uVar116 = uStack_11a0;
          local_11a8._0_4_ = local_1938._0_4_;
          local_11a8._4_4_ = local_1938._4_4_;
          uStack_11a0._0_4_ = local_1938._8_4_;
          uStack_11a0._4_4_ = local_1938._12_4_;
          local_1948._4_4_ = (int)local_11a8._4_4_;
          local_1948._0_4_ = (int)(float)local_11a8;
          local_1948._8_4_ = (int)(float)uStack_11a0;
          local_1948._12_4_ = (int)uStack_11a0._4_4_;
          local_ff8 = local_1948._0_8_;
          uStack_ff0 = local_1948._8_8_;
          local_1008 = 0x7f0000007f;
          uStack_1000 = 0x7f0000007f;
          auVar49._8_8_ = local_1948._8_8_;
          auVar49._0_8_ = local_1948._0_8_;
          auVar48._8_8_ = 0x7f0000007f;
          auVar48._0_8_ = 0x7f0000007f;
          auVar2 = vpaddd_avx(auVar49,auVar48);
          local_1948._0_8_ = auVar2._0_8_;
          local_1948._8_8_ = auVar2._8_8_;
          local_fb8 = local_1948._0_8_;
          uStack_fb0 = local_1948._8_8_;
          local_fbc = 0x17;
          local_1948 = vpslld_avx(auVar2,ZEXT416(0x17));
          local_f98 = local_1948._0_8_;
          uStack_f90 = local_1948._8_8_;
          local_1988 = local_1948._0_8_;
          uStack_1980 = local_1948._8_8_;
          local_1628 = local_1978;
          uStack_1620 = uStack_1970;
          local_1638 = local_1948._0_8_;
          uVar109 = local_1638;
          uStack_1630 = local_1948._8_8_;
          uVar110 = uStack_1630;
          local_1638._0_4_ = local_1948._0_4_;
          local_1638._4_4_ = local_1948._4_4_;
          uStack_1630._0_4_ = local_1948._8_4_;
          uStack_1630._4_4_ = local_1948._12_4_;
          local_1638._0_4_ = ((float)local_1668 + 1.0) * (float)local_1638;
          local_1638._4_4_ = (local_1668._4_4_ + 1.0) * local_1638._4_4_;
          uStack_1630._0_4_ = ((float)uStack_1660 + 1.0) * (float)uStack_1630;
          uStack_1630._4_4_ = (uStack_1660._4_4_ + 1.0) * uStack_1630._4_4_;
          local_1978 = CONCAT44(local_1638._4_4_,(float)local_1638);
          uStack_1970._0_4_ = (float)uStack_1630;
          uStack_1970._4_4_ = uStack_1630._4_4_;
          local_1b5c = 0x3f800000;
          local_1b78 = 0x3f800000;
          uStack_1b74 = 0x3f800000;
          uStack_1b70 = 0x3f800000;
          uStack_1b6c = 0x3f800000;
          local_1a88 = 0x3f8000003f800000;
          uStack_1a80 = 0x3f8000003f800000;
          local_1a78 = local_1978;
          uStack_1a70 = uStack_1970;
          local_778._4_4_ = local_1638._4_4_ + 1.0;
          local_778._0_4_ = (float)local_1638 + 1.0;
          uStack_770._0_4_ = (float)uStack_1630 + 1.0;
          uStack_770._4_4_ = uStack_1630._4_4_ + 1.0;
          local_798 = 0x3f800000;
          uStack_794 = 0x3f800000;
          uStack_790 = 0x3f800000;
          uStack_78c = 0x3f800000;
          local_3a8 = (undefined1  [16])0x0;
          local_198 = local_778;
          uStack_190 = uStack_770;
          local_1a8 = 0;
          uStack_1a0 = 0;
          auVar103._8_8_ = uStack_770;
          auVar103._0_8_ = local_778;
          local_7a8 = vcmpps_avx(auVar103,ZEXT816(0),2);
          local_388 = local_778;
          uStack_380 = uStack_770;
          local_398 = 0x800000;
          uStack_394 = 0x800000;
          uStack_390 = 0x800000;
          uStack_38c = 0x800000;
          auVar96._8_8_ = uStack_770;
          auVar96._0_8_ = local_778;
          auVar95._8_4_ = 0x800000;
          auVar95._0_8_ = 0x80000000800000;
          auVar95._12_4_ = 0x800000;
          auVar2 = vmaxps_avx(auVar96,auVar95);
          local_778 = auVar2._0_8_;
          uStack_770 = auVar2._8_8_;
          local_168 = local_778;
          uStack_160 = uStack_770;
          local_178 = local_778;
          uStack_170 = uStack_770;
          local_17c = 0x17;
          auVar1 = vpsrld_avx(auVar2,ZEXT416(0x17));
          local_218 = local_778;
          uStack_210 = uStack_770;
          local_228 = 0x807fffff;
          uStack_224 = 0x807fffff;
          uStack_220 = 0x807fffff;
          uStack_21c = 0x807fffff;
          auVar100._8_4_ = 0x807fffff;
          auVar100._0_8_ = 0x807fffff807fffff;
          auVar100._12_4_ = 0x807fffff;
          auVar2 = vpand_avx(auVar2,auVar100);
          local_778 = auVar2._0_8_;
          uStack_770 = auVar2._8_8_;
          local_128 = local_778;
          uStack_120 = uStack_770;
          local_138 = 0x3f000000;
          uStack_134 = 0x3f000000;
          uStack_130 = 0x3f000000;
          uStack_12c = 0x3f000000;
          auVar104._8_4_ = 0x3f000000;
          auVar104._0_8_ = 0x3f0000003f000000;
          auVar104._12_4_ = 0x3f000000;
          auVar3 = vpor_avx(auVar2,auVar104);
          local_788._0_8_ = auVar1._0_8_;
          local_788._8_8_ = auVar1._8_8_;
          local_108 = local_788._0_8_;
          uStack_100 = local_788._8_8_;
          local_118 = 0x7f0000007f;
          uStack_110 = 0x7f0000007f;
          auVar105._8_8_ = 0x7f0000007f;
          auVar105._0_8_ = 0x7f0000007f;
          local_788 = vpsubd_avx(auVar1,auVar105);
          local_278 = local_788._0_8_;
          uStack_270 = local_788._8_8_;
          auVar2 = vcvtdq2ps_avx(local_788);
          local_7b8 = auVar2._0_8_;
          uStack_7b0 = auVar2._8_8_;
          local_338 = 0x3f8000003f800000;
          uStack_330 = 0x3f8000003f800000;
          local_328 = local_7b8;
          uVar135 = local_328;
          uStack_320 = uStack_7b0;
          uVar136 = uStack_320;
          local_328._0_4_ = auVar2._0_4_;
          local_328._4_4_ = auVar2._4_4_;
          uStack_320._0_4_ = auVar2._8_4_;
          uStack_320._4_4_ = auVar2._12_4_;
          local_7b8._4_4_ = local_328._4_4_ + 1.0;
          local_7b8._0_4_ = (float)local_328 + 1.0;
          uStack_7b0._0_4_ = (float)uStack_320 + 1.0;
          uStack_7b0._4_4_ = uStack_320._4_4_ + 1.0;
          local_778 = auVar3._0_8_;
          uStack_770 = auVar3._8_8_;
          local_e8 = local_778;
          uStack_e0 = uStack_770;
          local_f8 = 0x3f3504f3;
          uStack_f4 = 0x3f3504f3;
          uStack_f0 = 0x3f3504f3;
          uStack_ec = 0x3f3504f3;
          auVar106._8_4_ = 0x3f3504f3;
          auVar106._0_8_ = 0x3f3504f33f3504f3;
          auVar106._12_4_ = 0x3f3504f3;
          local_7c8 = vcmpps_avx(auVar3,auVar106,1);
          local_238 = local_778;
          uStack_230 = uStack_770;
          local_248 = local_7c8._0_8_;
          uStack_240 = local_7c8._8_8_;
          local_7d8 = vpand_avx(auVar3,local_7c8);
          local_298 = 0x3f8000003f800000;
          uStack_290 = 0x3f8000003f800000;
          local_288 = local_778;
          uStack_280 = uStack_770;
          auVar98._8_8_ = 0x3f8000003f800000;
          auVar98._0_8_ = 0x3f8000003f800000;
          auVar2 = vsubps_avx(auVar3,auVar98);
          local_258 = 0x3f8000003f800000;
          uStack_250 = 0x3f8000003f800000;
          local_268 = local_7c8._0_8_;
          uStack_260 = local_7c8._8_8_;
          auVar99._8_8_ = 0x3f8000003f800000;
          auVar99._0_8_ = 0x3f8000003f800000;
          local_2b8 = vpand_avx(auVar99,local_7c8);
          local_2a8 = local_7b8;
          uStack_2a0 = uStack_7b0;
          auVar97._8_8_ = uStack_7b0;
          auVar97._0_8_ = local_7b8;
          _local_7b8 = vsubps_avx(auVar97,local_2b8);
          local_778 = auVar2._0_8_;
          uStack_770 = auVar2._8_8_;
          local_348 = local_778;
          uVar133 = local_348;
          uStack_340 = uStack_770;
          uVar134 = uStack_340;
          local_358 = local_7d8._0_8_;
          uVar131 = local_358;
          uStack_350 = local_7d8._8_8_;
          uVar132 = uStack_350;
          local_348._0_4_ = auVar2._0_4_;
          local_348._4_4_ = auVar2._4_4_;
          uStack_340._0_4_ = auVar2._8_4_;
          uStack_340._4_4_ = auVar2._12_4_;
          local_358._0_4_ = local_7d8._0_4_;
          local_358._4_4_ = local_7d8._4_4_;
          uStack_350._0_4_ = local_7d8._8_4_;
          uStack_350._4_4_ = local_7d8._12_4_;
          local_778._0_4_ = (float)local_348 + (float)local_358;
          local_778._4_4_ = local_348._4_4_ + local_358._4_4_;
          uStack_340._0_4_ = (float)uStack_340 + (float)uStack_350;
          uStack_340._4_4_ = uStack_340._4_4_ + uStack_350._4_4_;
          uStack_770._0_4_ = (float)uStack_340;
          uStack_770._4_4_ = uStack_340._4_4_;
          local_2c8 = local_778;
          uStack_2c0 = uStack_770;
          local_2d8 = local_778;
          uStack_2d0 = uStack_770;
          local_7e8 = (float)local_778._0_4_ * (float)local_778._0_4_;
          fStack_7e4 = (float)local_778._4_4_ * (float)local_778._4_4_;
          fStack_7e0 = (float)uStack_340 * (float)uStack_340;
          fStack_7dc = uStack_340._4_4_ * uStack_340._4_4_;
          uStack_7f0._0_4_ = 0x3d9021bb;
          local_7f8 = (undefined1  [8])0x3d9021bb3d9021bb;
          uStack_7f0._4_4_ = 0x3d9021bb;
          local_598 = 0x3d9021bb3d9021bb;
          uStack_590 = uStack_7f0;
          local_5a8 = local_778;
          uStack_5a0 = uStack_770;
          local_5b8 = 0xbdebd1b8;
          uStack_5b4 = 0xbdebd1b8;
          uStack_5b0 = 0xbdebd1b8;
          uStack_5ac = 0xbdebd1b8;
          local_588 = 0xbdebd1b8bdebd1b8;
          uStack_580 = 0xbdebd1b8bdebd1b8;
          local_568 = 0x3d9021bb3d9021bb;
          uStack_560 = uStack_7f0;
          local_578 = local_778;
          uStack_570 = uStack_770;
          auVar76._8_8_ = uStack_7f0;
          auVar76._0_8_ = 0x3d9021bb3d9021bb;
          auVar75._8_8_ = uStack_770;
          auVar75._0_8_ = local_778;
          auVar74._8_8_ = 0xbdebd1b8bdebd1b8;
          auVar74._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar2 = vfmadd213ps_fma(auVar75,auVar76,auVar74);
          local_7f8 = auVar2._0_8_;
          uStack_7f0 = auVar2._8_8_;
          local_5c8 = local_7f8;
          uStack_5c0 = uStack_7f0;
          local_5d8 = local_778;
          uStack_5d0 = uStack_770;
          local_5e8 = 0x3def251a;
          uStack_5e4 = 0x3def251a;
          uStack_5e0 = 0x3def251a;
          uStack_5dc = 0x3def251a;
          local_558 = 0x3def251a3def251a;
          uStack_550 = 0x3def251a3def251a;
          local_538 = local_7f8;
          uStack_530 = uStack_7f0;
          local_548 = local_778;
          uStack_540 = uStack_770;
          auVar78._8_8_ = uStack_770;
          auVar78._0_8_ = local_778;
          auVar77._8_8_ = 0x3def251a3def251a;
          auVar77._0_8_ = 0x3def251a3def251a;
          auVar2 = vfmadd213ps_fma(auVar78,auVar2,auVar77);
          local_7f8 = auVar2._0_8_;
          uStack_7f0 = auVar2._8_8_;
          local_5f8 = local_7f8;
          uStack_5f0 = uStack_7f0;
          local_608 = local_778;
          uStack_600 = uStack_770;
          local_618 = 0xbdfe5d4f;
          uStack_614 = 0xbdfe5d4f;
          uStack_610 = 0xbdfe5d4f;
          uStack_60c = 0xbdfe5d4f;
          local_528 = 0xbdfe5d4fbdfe5d4f;
          uStack_520 = 0xbdfe5d4fbdfe5d4f;
          local_508 = local_7f8;
          uStack_500 = uStack_7f0;
          local_518 = local_778;
          uStack_510 = uStack_770;
          auVar80._8_8_ = uStack_770;
          auVar80._0_8_ = local_778;
          auVar79._8_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar79._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar2 = vfmadd213ps_fma(auVar80,auVar2,auVar79);
          local_7f8 = auVar2._0_8_;
          uStack_7f0 = auVar2._8_8_;
          local_628 = local_7f8;
          uStack_620 = uStack_7f0;
          local_638 = local_778;
          uStack_630 = uStack_770;
          local_648 = 0x3e11e9bf;
          uStack_644 = 0x3e11e9bf;
          uStack_640 = 0x3e11e9bf;
          uStack_63c = 0x3e11e9bf;
          local_4f8 = 0x3e11e9bf3e11e9bf;
          uStack_4f0 = 0x3e11e9bf3e11e9bf;
          local_4d8 = local_7f8;
          uStack_4d0 = uStack_7f0;
          local_4e8 = local_778;
          uStack_4e0 = uStack_770;
          auVar82._8_8_ = uStack_770;
          auVar82._0_8_ = local_778;
          auVar81._8_8_ = 0x3e11e9bf3e11e9bf;
          auVar81._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar2 = vfmadd213ps_fma(auVar82,auVar2,auVar81);
          local_7f8 = auVar2._0_8_;
          uStack_7f0 = auVar2._8_8_;
          local_658 = local_7f8;
          uStack_650 = uStack_7f0;
          local_668 = local_778;
          uStack_660 = uStack_770;
          local_678 = 0xbe2aae50;
          uStack_674 = 0xbe2aae50;
          uStack_670 = 0xbe2aae50;
          uStack_66c = 0xbe2aae50;
          local_4c8 = 0xbe2aae50be2aae50;
          uStack_4c0 = 0xbe2aae50be2aae50;
          local_4a8 = local_7f8;
          uStack_4a0 = uStack_7f0;
          local_4b8 = local_778;
          uStack_4b0 = uStack_770;
          auVar84._8_8_ = uStack_770;
          auVar84._0_8_ = local_778;
          auVar83._8_8_ = 0xbe2aae50be2aae50;
          auVar83._0_8_ = 0xbe2aae50be2aae50;
          auVar2 = vfmadd213ps_fma(auVar84,auVar2,auVar83);
          local_7f8 = auVar2._0_8_;
          uStack_7f0 = auVar2._8_8_;
          local_688 = local_7f8;
          uStack_680 = uStack_7f0;
          local_698 = local_778;
          uStack_690 = uStack_770;
          local_6a8 = 0x3e4cceac;
          uStack_6a4 = 0x3e4cceac;
          uStack_6a0 = 0x3e4cceac;
          uStack_69c = 0x3e4cceac;
          local_498 = 0x3e4cceac3e4cceac;
          uStack_490 = 0x3e4cceac3e4cceac;
          local_478 = local_7f8;
          uStack_470 = uStack_7f0;
          local_488 = local_778;
          uStack_480 = uStack_770;
          auVar86._8_8_ = uStack_770;
          auVar86._0_8_ = local_778;
          auVar85._8_8_ = 0x3e4cceac3e4cceac;
          auVar85._0_8_ = 0x3e4cceac3e4cceac;
          auVar2 = vfmadd213ps_fma(auVar86,auVar2,auVar85);
          local_7f8 = auVar2._0_8_;
          uStack_7f0 = auVar2._8_8_;
          local_6b8 = local_7f8;
          uStack_6b0 = uStack_7f0;
          local_6c8 = local_778;
          uStack_6c0 = uStack_770;
          local_6d8 = 0xbe7ffffc;
          uStack_6d4 = 0xbe7ffffc;
          uStack_6d0 = 0xbe7ffffc;
          uStack_6cc = 0xbe7ffffc;
          local_468 = 0xbe7ffffcbe7ffffc;
          uStack_460 = 0xbe7ffffcbe7ffffc;
          local_448 = local_7f8;
          uStack_440 = uStack_7f0;
          local_458 = local_778;
          uStack_450 = uStack_770;
          auVar88._8_8_ = uStack_770;
          auVar88._0_8_ = local_778;
          auVar87._8_8_ = 0xbe7ffffcbe7ffffc;
          auVar87._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar2 = vfmadd213ps_fma(auVar88,auVar2,auVar87);
          local_7f8 = auVar2._0_8_;
          uStack_7f0 = auVar2._8_8_;
          local_6e8 = local_7f8;
          uStack_6e0 = uStack_7f0;
          local_6f8 = local_778;
          uStack_6f0 = uStack_770;
          local_708 = 0x3eaaaaaa;
          uStack_704 = 0x3eaaaaaa;
          uStack_700 = 0x3eaaaaaa;
          uStack_6fc = 0x3eaaaaaa;
          local_438 = 0x3eaaaaaa3eaaaaaa;
          uStack_430 = 0x3eaaaaaa3eaaaaaa;
          local_418 = local_7f8;
          uStack_410 = uStack_7f0;
          local_428 = local_778;
          uStack_420 = uStack_770;
          auVar90._8_8_ = uStack_770;
          auVar90._0_8_ = local_778;
          auVar89._8_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar89._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar2 = vfmadd213ps_fma(auVar90,auVar2,auVar89);
          local_7f8 = auVar2._0_8_;
          uStack_7f0 = auVar2._8_8_;
          local_2e8 = local_7f8;
          uVar137 = local_2e8;
          uStack_2e0 = uStack_7f0;
          uVar138 = uStack_2e0;
          local_2f8 = local_778;
          uStack_2f0 = uStack_770;
          local_2e8._0_4_ = auVar2._0_4_;
          local_2e8._4_4_ = auVar2._4_4_;
          uStack_2e0._0_4_ = auVar2._8_4_;
          uStack_2e0._4_4_ = auVar2._12_4_;
          local_7f8._4_4_ = local_2e8._4_4_ * (float)local_778._4_4_;
          local_7f8._0_4_ = (float)local_2e8 * (float)local_778._0_4_;
          uStack_7f0._0_4_ = (float)uStack_2e0 * (float)uStack_340;
          uStack_7f0._4_4_ = uStack_2e0._4_4_ * uStack_340._4_4_;
          local_318 = CONCAT44(fStack_7e4,local_7e8);
          uStack_310 = CONCAT44(fStack_7dc,fStack_7e0);
          local_308 = local_7f8;
          uStack_300 = uStack_7f0;
          local_7f8._4_4_ = local_2e8._4_4_ * (float)local_778._4_4_ * fStack_7e4;
          local_7f8._0_4_ = (float)local_2e8 * (float)local_778._0_4_ * local_7e8;
          uStack_7f0._0_4_ = (float)uStack_2e0 * (float)uStack_340 * fStack_7e0;
          uStack_7f0._4_4_ = uStack_2e0._4_4_ * uStack_340._4_4_ * fStack_7dc;
          local_718 = local_7b8;
          uStack_710 = uStack_7b0;
          local_728 = 0xb95e8083;
          uStack_724 = 0xb95e8083;
          uStack_720 = 0xb95e8083;
          uStack_71c = 0xb95e8083;
          local_738 = local_7f8;
          uStack_730 = uStack_7f0;
          local_3f8 = 0xb95e8083b95e8083;
          uStack_3f0 = 0xb95e8083b95e8083;
          local_3e8 = local_7b8;
          uStack_3e0 = uStack_7b0;
          local_408 = local_7f8;
          uStack_400 = uStack_7f0;
          auVar92._8_8_ = 0xb95e8083b95e8083;
          auVar92._0_8_ = 0xb95e8083b95e8083;
          auVar91._8_8_ = uStack_7f0;
          auVar91._0_8_ = local_7f8;
          auVar2 = vfmadd213ps_fma(auVar92,_local_7b8,auVar91);
          local_1e8 = CONCAT44(fStack_7e4,local_7e8);
          uStack_1e0 = CONCAT44(fStack_7dc,fStack_7e0);
          local_7f8 = auVar2._0_8_;
          uStack_7f0 = auVar2._8_8_;
          local_1f8 = 0x3f000000;
          uStack_1f4 = 0x3f000000;
          uStack_1f0 = 0x3f000000;
          uStack_1ec = 0x3f000000;
          local_208 = local_7f8;
          uStack_200 = uStack_7f0;
          local_1c8 = 0x3f0000003f000000;
          uStack_1c0 = 0x3f0000003f000000;
          local_1d8 = local_7f8;
          uStack_1d0 = uStack_7f0;
          auVar102._8_8_ = uStack_1e0;
          auVar102._0_8_ = local_1e8;
          auVar101._8_8_ = 0x3f0000003f000000;
          auVar101._0_8_ = 0x3f0000003f000000;
          _local_7f8 = vfnmadd213ps_fma(auVar101,auVar102,auVar2);
          local_368 = local_778;
          uStack_360 = uStack_770;
          local_378 = local_7f8;
          uVar129 = local_378;
          uStack_370 = uStack_7f0;
          uVar130 = uStack_370;
          local_378._0_4_ = local_7f8._0_4_;
          local_378._4_4_ = local_7f8._4_4_;
          uStack_370._0_4_ = local_7f8._8_4_;
          uStack_370._4_4_ = local_7f8._12_4_;
          local_778._4_4_ = (float)local_778._4_4_ + local_378._4_4_;
          local_778._0_4_ = (float)local_778._0_4_ + (float)local_378;
          uStack_770._0_4_ = (float)uStack_340 + (float)uStack_370;
          uStack_770._4_4_ = uStack_340._4_4_ + uStack_370._4_4_;
          local_748 = local_7b8;
          uStack_740 = uStack_7b0;
          local_758 = 0x3f318000;
          uStack_754 = 0x3f318000;
          uStack_750 = 0x3f318000;
          uStack_74c = 0x3f318000;
          local_768 = local_778;
          uStack_760 = uStack_770;
          local_3c8 = 0x3f3180003f318000;
          uStack_3c0 = 0x3f3180003f318000;
          local_3b8 = local_7b8;
          uStack_3b0 = uStack_7b0;
          local_3d8 = local_778;
          uStack_3d0 = uStack_770;
          auVar94._8_8_ = 0x3f3180003f318000;
          auVar94._0_8_ = 0x3f3180003f318000;
          auVar93._8_8_ = uStack_770;
          auVar93._0_8_ = local_778;
          auVar2 = vfmadd213ps_fma(auVar94,_local_7b8,auVar93);
          local_778 = auVar2._0_8_;
          uStack_770 = auVar2._8_8_;
          local_148 = local_778;
          uStack_140 = uStack_770;
          local_158 = local_7a8._0_8_;
          uStack_150 = local_7a8._8_8_;
          _local_778 = vpor_avx(auVar2,local_7a8);
          local_ea8 = local_778;
          uStack_ea0 = uStack_770;
          local_e5c = 0x3f800000;
          local_e78 = 0x3f800000;
          uStack_e74 = 0x3f800000;
          uStack_e70 = 0x3f800000;
          uStack_e6c = 0x3f800000;
          local_eb8 = 0x3f8000003f800000;
          uStack_eb0 = 0x3f8000003f800000;
          local_e7c = 0x40000000;
          local_e98 = 0x40000000;
          uStack_e94 = 0x40000000;
          uStack_e90 = 0x40000000;
          uStack_e8c = 0x40000000;
          local_ec8 = 0x4000000040000000;
          uStack_ec0 = 0x4000000040000000;
          local_db8 = local_778;
          uVar117 = local_db8;
          uStack_db0 = uStack_770;
          uVar118 = uStack_db0;
          local_db8._0_4_ = local_778._0_4_;
          local_db8._4_4_ = local_778._4_4_;
          uStack_db0._0_4_ = local_778._8_4_;
          uStack_db0._4_4_ = local_778._12_4_;
          local_e48 = (float)local_db8 * 2.0;
          fStack_e44 = local_db8._4_4_ * 2.0;
          fStack_e40 = (float)uStack_db0 * 2.0;
          fStack_e3c = uStack_db0._4_4_ * 2.0;
          local_e0c = 0x3f800000;
          local_e28 = 0x3f800000;
          uStack_e24 = 0x3f800000;
          uStack_e20 = 0x3f800000;
          uStack_e1c = 0x3f800000;
          local_e58 = 0x3f8000003f800000;
          uStack_e50 = 0x3f8000003f800000;
          local_df8._8_8_ = 0x3f8000003f800000;
          local_df8._0_8_ = 0x3f8000003f800000;
          local_e38 = (undefined1  [16])0x0;
          local_9b8 = CONCAT44(fStack_e44,local_e48);
          uStack_9b0 = CONCAT44(fStack_e3c,fStack_e40);
          local_9a8 = 0;
          uStack_9a0 = 0;
          auVar64._8_8_ = uStack_9b0;
          auVar64._0_8_ = local_9b8;
          auVar2 = vsubps_avx(ZEXT816(0),auVar64);
          local_ac8 = (undefined1  [16])0x0;
          local_d58 = 0x3f800000;
          uStack_d54 = 0x3f800000;
          uStack_d50 = 0x3f800000;
          uStack_d4c = 0x3f800000;
          local_d18._0_8_ = auVar2._0_8_;
          local_d18._8_8_ = auVar2._8_8_;
          local_a88 = local_d18._0_8_;
          uStack_a80 = local_d18._8_8_;
          local_a98 = 0x42b0c0a5;
          uStack_a94 = 0x42b0c0a5;
          uStack_a90 = 0x42b0c0a5;
          uStack_a8c = 0x42b0c0a5;
          auVar63._8_4_ = 0x42b0c0a5;
          auVar63._0_8_ = 0x42b0c0a542b0c0a5;
          auVar63._12_4_ = 0x42b0c0a5;
          auVar2 = vminps_avx(auVar2,auVar63);
          local_d18._0_8_ = auVar2._0_8_;
          local_d18._8_8_ = auVar2._8_8_;
          local_aa8 = local_d18._0_8_;
          uStack_aa0 = local_d18._8_8_;
          local_ab8 = 0xc2b0c0a5;
          uStack_ab4 = 0xc2b0c0a5;
          uStack_ab0 = 0xc2b0c0a5;
          uStack_aac = 0xc2b0c0a5;
          auVar62._8_4_ = 0xc2b0c0a5;
          auVar62._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar62._12_4_ = 0xc2b0c0a5;
          auVar1 = vmaxps_avx(auVar2,auVar62);
          local_d18._0_8_ = auVar1._0_8_;
          local_d18._8_8_ = auVar1._8_8_;
          local_9e8 = local_d18._0_8_;
          uVar125 = local_9e8;
          uStack_9e0 = local_d18._8_8_;
          uVar126 = uStack_9e0;
          local_9f8 = 0x3fb8aa3b;
          uStack_9f4 = 0x3fb8aa3b;
          uStack_9f0 = 0x3fb8aa3b;
          uStack_9ec = 0x3fb8aa3b;
          local_9e8._0_4_ = auVar1._0_4_;
          local_9e8._4_4_ = auVar1._4_4_;
          uStack_9e0._0_4_ = auVar1._8_4_;
          uStack_9e0._4_4_ = auVar1._12_4_;
          local_d38._4_4_ = local_9e8._4_4_ * 1.442695;
          local_d38._0_4_ = (float)local_9e8 * 1.442695;
          uStack_d30._0_4_ = (float)uStack_9e0 * 1.442695;
          uStack_d30._4_4_ = uStack_9e0._4_4_ * 1.442695;
          local_a48 = local_d38;
          uStack_a40 = uStack_d30;
          local_a58 = 0x3f000000;
          uStack_a54 = 0x3f000000;
          uStack_a50 = 0x3f000000;
          uStack_a4c = 0x3f000000;
          local_d38._0_4_ = (float)local_9e8 * 1.442695 + 0.5;
          local_d38._4_4_ = local_9e8._4_4_ * 1.442695 + 0.5;
          fVar139 = (float)uStack_9e0 * 1.442695 + 0.5;
          fVar140 = uStack_9e0._4_4_ * 1.442695 + 0.5;
          uStack_d30._0_4_ = fVar139;
          uStack_d30._4_4_ = fVar140;
          local_968 = local_d38;
          uStack_960 = uStack_d30;
          local_d48._4_4_ = (int)(float)local_d38._4_4_;
          local_d48._0_4_ = (int)(float)local_d38._0_4_;
          local_d48._8_4_ = (int)fVar139;
          local_d48._12_4_ = (int)fVar140;
          local_958 = local_d48._0_8_;
          uStack_950 = local_d48._8_8_;
          auVar67._8_8_ = local_d48._8_8_;
          auVar67._0_8_ = local_d48._0_8_;
          auVar3 = vcvtdq2ps_avx(auVar67);
          local_d28 = auVar3._0_8_;
          uStack_d20 = auVar3._8_8_;
          local_938 = local_d28;
          uStack_930 = uStack_d20;
          local_948 = local_d38;
          uStack_940 = uStack_d30;
          auVar68._8_8_ = uStack_d30;
          auVar68._0_8_ = local_d38;
          auVar2 = vcmpps_avx(auVar68,auVar3,1);
          local_d68._0_8_ = auVar2._0_8_;
          local_d68._8_8_ = auVar2._8_8_;
          local_928 = 0x3f8000003f800000;
          uStack_920 = 0x3f8000003f800000;
          local_918 = local_d68._0_8_;
          uStack_910 = local_d68._8_8_;
          auVar69._8_8_ = 0x3f8000003f800000;
          auVar69._0_8_ = 0x3f8000003f800000;
          local_d68 = vpand_avx(auVar2,auVar69);
          local_9c8 = local_d28;
          uStack_9c0 = uStack_d20;
          local_9d8 = local_d68._0_8_;
          uStack_9d0 = local_d68._8_8_;
          _local_d38 = vsubps_avx(auVar3,local_d68);
          local_8b8 = local_d38;
          uStack_8b0 = uStack_d30;
          local_8c8 = 0x3f318000;
          uStack_8c4 = 0x3f318000;
          uStack_8c0 = 0x3f318000;
          uStack_8bc = 0x3f318000;
          local_8d8 = local_d18._0_8_;
          uStack_8d0 = local_d18._8_8_;
          local_848 = 0x3f3180003f318000;
          uStack_840 = 0x3f3180003f318000;
          local_838 = local_d38;
          uStack_830 = uStack_d30;
          local_858 = local_d18._0_8_;
          uStack_850 = local_d18._8_8_;
          auVar72._8_8_ = 0x3f3180003f318000;
          auVar72._0_8_ = 0x3f3180003f318000;
          auVar2 = vfnmadd213ps_fma(auVar72,_local_d38,auVar1);
          local_d18._0_8_ = auVar2._0_8_;
          local_d18._8_8_ = auVar2._8_8_;
          local_8e8 = local_d38;
          uStack_8e0 = uStack_d30;
          local_8f8 = 0xb95e8083;
          uStack_8f4 = 0xb95e8083;
          uStack_8f0 = 0xb95e8083;
          uStack_8ec = 0xb95e8083;
          local_908 = local_d18._0_8_;
          uStack_900 = local_d18._8_8_;
          local_818 = 0xb95e8083b95e8083;
          uStack_810 = 0xb95e8083b95e8083;
          local_808 = local_d38;
          uStack_800 = uStack_d30;
          local_828 = local_d18._0_8_;
          uStack_820 = local_d18._8_8_;
          auVar73._8_8_ = 0xb95e8083b95e8083;
          auVar73._0_8_ = 0xb95e8083b95e8083;
          local_d18 = vfnmadd213ps_fma(auVar73,_local_d38,auVar2);
          local_a08 = local_d18._0_8_;
          uVar123 = local_a08;
          uStack_a00 = local_d18._8_8_;
          uVar124 = uStack_a00;
          local_a18 = local_d18._0_8_;
          uStack_a10 = local_d18._8_8_;
          local_a08._0_4_ = local_d18._0_4_;
          local_a08._4_4_ = local_d18._4_4_;
          uStack_a00._0_4_ = local_d18._8_4_;
          uStack_a00._4_4_ = local_d18._12_4_;
          local_d28 = CONCAT44(local_a08._4_4_ * local_a08._4_4_,(float)local_a08 * (float)local_a08
                              );
          uStack_d20._0_4_ = (float)uStack_a00 * (float)uStack_a00;
          uStack_d20._4_4_ = uStack_a00._4_4_ * uStack_a00._4_4_;
          uStack_d70._0_4_ = 0x39506967;
          local_d78 = 0x3950696739506967;
          uStack_d70._4_4_ = 0x39506967;
          local_bf8 = 0x3950696739506967;
          uStack_bf0 = uStack_d70;
          local_c08 = local_d18._0_8_;
          uStack_c00 = local_d18._8_8_;
          local_c18 = 0x3ab743ce;
          uStack_c14 = 0x3ab743ce;
          uStack_c10 = 0x3ab743ce;
          uStack_c0c = 0x3ab743ce;
          local_be8 = 0x3ab743ce3ab743ce;
          uStack_be0 = 0x3ab743ce3ab743ce;
          local_bc8 = 0x3950696739506967;
          uStack_bc0 = uStack_d70;
          local_bd8 = local_d18._0_8_;
          uStack_bd0 = local_d18._8_8_;
          auVar56._8_8_ = uStack_d70;
          auVar56._0_8_ = 0x3950696739506967;
          auVar55._8_8_ = 0x3ab743ce3ab743ce;
          auVar55._0_8_ = 0x3ab743ce3ab743ce;
          auVar2 = vfmadd213ps_fma(local_d18,auVar56,auVar55);
          local_d78 = auVar2._0_8_;
          uStack_d70 = auVar2._8_8_;
          local_c28 = local_d78;
          uStack_c20 = uStack_d70;
          local_c38 = local_d18._0_8_;
          uStack_c30 = local_d18._8_8_;
          local_c48 = 0x3c088908;
          uStack_c44 = 0x3c088908;
          uStack_c40 = 0x3c088908;
          uStack_c3c = 0x3c088908;
          local_bb8 = 0x3c0889083c088908;
          uStack_bb0 = 0x3c0889083c088908;
          local_b98 = local_d78;
          uStack_b90 = uStack_d70;
          local_ba8 = local_d18._0_8_;
          uStack_ba0 = local_d18._8_8_;
          auVar57._8_8_ = 0x3c0889083c088908;
          auVar57._0_8_ = 0x3c0889083c088908;
          auVar2 = vfmadd213ps_fma(local_d18,auVar2,auVar57);
          local_d78 = auVar2._0_8_;
          uStack_d70 = auVar2._8_8_;
          local_c58 = local_d78;
          uStack_c50 = uStack_d70;
          local_c68 = local_d18._0_8_;
          uStack_c60 = local_d18._8_8_;
          local_c78 = 0x3d2aa9c1;
          uStack_c74 = 0x3d2aa9c1;
          uStack_c70 = 0x3d2aa9c1;
          uStack_c6c = 0x3d2aa9c1;
          local_b88 = 0x3d2aa9c13d2aa9c1;
          uStack_b80 = 0x3d2aa9c13d2aa9c1;
          local_b68 = local_d78;
          uStack_b60 = uStack_d70;
          local_b78 = local_d18._0_8_;
          uStack_b70 = local_d18._8_8_;
          auVar58._8_8_ = 0x3d2aa9c13d2aa9c1;
          auVar58._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar2 = vfmadd213ps_fma(local_d18,auVar2,auVar58);
          local_d78 = auVar2._0_8_;
          uStack_d70 = auVar2._8_8_;
          local_c88 = local_d78;
          uStack_c80 = uStack_d70;
          local_c98 = local_d18._0_8_;
          uStack_c90 = local_d18._8_8_;
          local_ca8 = 0x3e2aaaaa;
          uStack_ca4 = 0x3e2aaaaa;
          uStack_ca0 = 0x3e2aaaaa;
          uStack_c9c = 0x3e2aaaaa;
          local_b58 = 0x3e2aaaaa3e2aaaaa;
          uStack_b50 = 0x3e2aaaaa3e2aaaaa;
          local_b38 = local_d78;
          uStack_b30 = uStack_d70;
          local_b48 = local_d18._0_8_;
          uStack_b40 = local_d18._8_8_;
          auVar59._8_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar59._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar2 = vfmadd213ps_fma(local_d18,auVar2,auVar59);
          local_d78 = auVar2._0_8_;
          uStack_d70 = auVar2._8_8_;
          local_cb8 = local_d78;
          uStack_cb0 = uStack_d70;
          local_cc8 = local_d18._0_8_;
          uStack_cc0 = local_d18._8_8_;
          local_cd8 = 0x3f000000;
          uStack_cd4 = 0x3f000000;
          uStack_cd0 = 0x3f000000;
          uStack_ccc = 0x3f000000;
          local_b28 = 0x3f0000003f000000;
          uStack_b20 = 0x3f0000003f000000;
          local_b08 = local_d78;
          uStack_b00 = uStack_d70;
          local_b18 = local_d18._0_8_;
          uStack_b10 = local_d18._8_8_;
          auVar60._8_8_ = 0x3f0000003f000000;
          auVar60._0_8_ = 0x3f0000003f000000;
          auVar2 = vfmadd213ps_fma(local_d18,auVar2,auVar60);
          local_d78 = auVar2._0_8_;
          uStack_d70 = auVar2._8_8_;
          local_ce8 = local_d78;
          uStack_ce0 = uStack_d70;
          local_cf8 = local_d28;
          uStack_cf0 = uStack_d20;
          local_d08 = local_d18._0_8_;
          uStack_d00 = local_d18._8_8_;
          local_ad8 = local_d78;
          uStack_ad0 = uStack_d70;
          local_ae8 = local_d28;
          uStack_ae0 = uStack_d20;
          local_af8 = local_d18._0_8_;
          uStack_af0 = local_d18._8_8_;
          auVar61._8_8_ = uStack_d20;
          auVar61._0_8_ = local_d28;
          auVar2 = vfmadd213ps_fma(auVar61,auVar2,local_d18);
          local_d78 = auVar2._0_8_;
          uStack_d70 = auVar2._8_8_;
          local_a78 = 0x3f8000003f800000;
          uStack_a70 = 0x3f8000003f800000;
          local_a68 = local_d78;
          uVar119 = local_a68;
          uStack_a60 = uStack_d70;
          uVar120 = uStack_a60;
          local_a68._0_4_ = auVar2._0_4_;
          local_a68._4_4_ = auVar2._4_4_;
          uStack_a60._0_4_ = auVar2._8_4_;
          uStack_a60._4_4_ = auVar2._12_4_;
          local_d78 = CONCAT44(local_a68._4_4_ + 1.0,(float)local_a68 + 1.0);
          uStack_d70._0_4_ = (float)uStack_a60 + 1.0;
          uStack_d70._4_4_ = uStack_a60._4_4_ + 1.0;
          local_978 = local_d38;
          uVar127 = local_978;
          uStack_970 = uStack_d30;
          uVar128 = uStack_970;
          local_978._0_4_ = local_d38._0_4_;
          local_978._4_4_ = local_d38._4_4_;
          uStack_970._0_4_ = local_d38._8_4_;
          uStack_970._4_4_ = local_d38._12_4_;
          local_d48._4_4_ = (int)local_978._4_4_;
          local_d48._0_4_ = (int)(float)local_978;
          local_d48._8_4_ = (int)(float)uStack_970;
          local_d48._12_4_ = (int)uStack_970._4_4_;
          local_898 = local_d48._0_8_;
          uStack_890 = local_d48._8_8_;
          local_8a8 = 0x7f0000007f;
          uStack_8a0 = 0x7f0000007f;
          auVar71._8_8_ = local_d48._8_8_;
          auVar71._0_8_ = local_d48._0_8_;
          auVar70._8_8_ = 0x7f0000007f;
          auVar70._0_8_ = 0x7f0000007f;
          auVar2 = vpaddd_avx(auVar71,auVar70);
          local_d48._0_8_ = auVar2._0_8_;
          local_d48._8_8_ = auVar2._8_8_;
          local_878 = local_d48._0_8_;
          uStack_870 = local_d48._8_8_;
          local_87c = 0x17;
          local_d48 = vpslld_avx(auVar2,ZEXT416(0x17));
          local_868 = local_d48._0_8_;
          uStack_860 = local_d48._8_8_;
          local_d88 = local_d48._0_8_;
          uStack_d80 = local_d48._8_8_;
          local_a28 = local_d78;
          uStack_a20 = uStack_d70;
          local_a38 = local_d48._0_8_;
          uVar121 = local_a38;
          uStack_a30 = local_d48._8_8_;
          uVar122 = uStack_a30;
          local_a38._0_4_ = local_d48._0_4_;
          local_a38._4_4_ = local_d48._4_4_;
          uStack_a30._0_4_ = local_d48._8_4_;
          uStack_a30._4_4_ = local_d48._12_4_;
          local_a38._0_4_ = ((float)local_a68 + 1.0) * (float)local_a38;
          local_a38._4_4_ = (local_a68._4_4_ + 1.0) * local_a38._4_4_;
          uStack_a30._0_4_ = ((float)uStack_a60 + 1.0) * (float)uStack_a30;
          uStack_a30._4_4_ = (uStack_a60._4_4_ + 1.0) * uStack_a30._4_4_;
          local_d78 = CONCAT44(local_a38._4_4_,(float)local_a38);
          uStack_d70._0_4_ = (float)uStack_a30;
          uStack_d70._4_4_ = uStack_a30._4_4_;
          local_e08 = local_d78;
          uStack_e00 = uStack_d70;
          local_da8 = (float)local_a38 + 1.0;
          fStack_da4 = local_a38._4_4_ + 1.0;
          fStack_da0 = (float)uStack_a30 + 1.0;
          fStack_d9c = uStack_a30._4_4_ + 1.0;
          auVar54._4_4_ = fStack_da4;
          auVar54._0_4_ = local_da8;
          auVar54._8_4_ = fStack_da0;
          auVar54._12_4_ = fStack_d9c;
          _local_dd8 = vdivps_avx(local_df8,auVar54);
          local_988 = (float)local_dd8._0_4_ * 2.0;
          fStack_984 = (float)local_dd8._4_4_ * 2.0;
          fStack_980 = fStack_dd0 * 2.0;
          fStack_97c = fStack_dcc * 2.0;
          auVar66._4_4_ = fStack_984;
          auVar66._0_4_ = local_988;
          auVar66._8_4_ = fStack_980;
          auVar66._12_4_ = fStack_97c;
          auVar65._8_8_ = 0x3f8000003f800000;
          auVar65._0_8_ = 0x3f8000003f800000;
          auVar2 = vsubps_avx(auVar66,auVar65);
          local_19e8._0_4_ = auVar2._0_4_;
          local_19e8._4_4_ = auVar2._4_4_;
          uStack_19e0._0_4_ = auVar2._8_4_;
          uStack_19e0._4_4_ = auVar2._12_4_;
          in_stack_ffffffffffffd420 = (float)local_19d8._8_4_ * (float)uStack_19e0;
          in_stack_ffffffffffffd424 = fStack_19cc * uStack_19e0._4_4_;
          local_1e08._4_4_ = local_1a28._4_4_ * local_19e8._4_4_;
          local_1e08._0_4_ = (float)local_1a28 * (float)local_19e8;
          uStack_1e00._4_4_ = in_stack_ffffffffffffd424;
          uStack_1e00._0_4_ = in_stack_ffffffffffffd420;
          local_19e8 = auVar2._0_8_;
          uStack_19e0 = auVar2._8_8_;
          _local_19d8 = local_2698;
          local_1668 = uVar107;
          uStack_1660 = uVar108;
          local_1638 = uVar109;
          uStack_1630 = uVar110;
          local_1608 = uVar111;
          uStack_1600 = uVar112;
          local_15e8 = uVar113;
          uStack_15e0 = uVar114;
          local_11a8 = uVar115;
          uStack_11a0 = uVar116;
          local_de8 = local_ec8;
          uStack_de0 = uStack_ec0;
          local_dc8 = local_ec8;
          uStack_dc0 = uStack_ec0;
          local_db8 = uVar117;
          uStack_db0 = uVar118;
          local_d98 = local_df8;
          local_a68 = uVar119;
          uStack_a60 = uVar120;
          local_a38 = uVar121;
          uStack_a30 = uVar122;
          local_a08 = uVar123;
          uStack_a00 = uVar124;
          local_9e8 = uVar125;
          uStack_9e0 = uVar126;
          local_998 = local_eb8;
          uStack_990 = uStack_eb0;
          local_978 = uVar127;
          uStack_970 = uVar128;
          local_378 = uVar129;
          uStack_370 = uVar130;
          local_358 = uVar131;
          uStack_350 = uVar132;
          local_348 = uVar133;
          uStack_340 = uVar134;
          local_328 = uVar135;
          uStack_320 = uVar136;
          local_2e8 = uVar137;
          uStack_2e0 = uVar138;
          local_1b8 = local_1e8;
          uStack_1b0 = uStack_1e0;
          break;
        case 6:
          local_1de0 = in_stack_00000030;
          local_1de8 = 0;
          local_1c38 = *(float *)*in_stack_00000030;
          local_1e58 = CONCAT44(local_1c38,local_1c38);
          uStack_1e50 = CONCAT44(local_1c38,local_1c38);
          local_1df0 = in_stack_00000030;
          local_1df8 = 1;
          local_1c58 = *(float *)(*in_stack_00000030 + 4);
          local_1e68 = CONCAT44(local_1c58,local_1c58);
          uStack_1e60 = CONCAT44(local_1c58,local_1c58);
          local_1b28 = local_2698;
          local_1acc = 0x3f800000;
          local_1ae8 = 0x3f800000;
          uStack_1ae4 = 0x3f800000;
          uStack_1ae0 = 0x3f800000;
          uStack_1adc = 0x3f800000;
          local_1b58 = 0x3f8000003f800000;
          uStack_1b50 = 0x3f8000003f800000;
          local_19f8 = local_2698._0_8_;
          uStack_19f0 = local_2698._8_8_;
          local_1a98 = (float)local_1a28 * local_1c38;
          fStack_1a94 = local_1a28._4_4_ * local_1c38;
          fStack_1a90 = (float)local_19d8._8_4_ * local_1c38;
          fStack_1a8c = fStack_19cc * local_1c38;
          local_1b48._4_4_ = fStack_1a94 + local_1c58;
          local_1b48._0_4_ = local_1a98 + local_1c58;
          uStack_1b40._0_4_ = fStack_1a90 + local_1c58;
          uStack_1b40._4_4_ = fStack_1a8c + local_1c58;
          local_1b18 = (undefined1  [16])0x0;
          local_1af8 = local_1b48;
          uStack_1af0 = uStack_1b40;
          local_1b08 = 0;
          uStack_1b00 = 0;
          auVar2._8_8_ = uStack_1b40;
          auVar2._0_8_ = local_1b48;
          auVar2 = vmaxps_avx(auVar2,ZEXT816(0));
          local_1b48 = auVar2._0_8_;
          uStack_1b40 = auVar2._8_8_;
          local_1ab8 = local_1b48;
          uStack_1ab0 = uStack_1b40;
          auVar20._8_8_ = 0x3f8000003f800000;
          auVar20._0_8_ = 0x3f8000003f800000;
          _local_1b48 = vminps_avx(auVar2,auVar20);
          local_1a28 = local_2698._0_8_;
          uStack_1a20 = local_2698._8_8_;
          local_1a18._0_4_ = local_1b48._0_4_;
          local_1a18._4_4_ = local_1b48._4_4_;
          fStack_1a10 = local_1b48._8_4_;
          fStack_1a0c = local_1b48._12_4_;
          local_1e08._4_4_ = (float)local_1a18._4_4_ * fVar140;
          local_1e08._0_4_ = (float)local_1a18._0_4_ * fVar139;
          uStack_1e00._0_4_ = fStack_1a10 * (float)local_19d8._8_4_;
          uStack_1e00._4_4_ = fStack_1a0c * fStack_19cc;
          fStack_1c54 = local_1c58;
          fStack_1c50 = local_1c58;
          fStack_1c4c = local_1c58;
          local_1c3c = local_1c58;
          fStack_1c34 = local_1c38;
          fStack_1c30 = local_1c38;
          fStack_1c2c = local_1c38;
          local_1c1c = local_1c38;
          local_1b38 = local_1e58;
          uStack_1b30 = uStack_1e50;
          local_1ac8 = local_1b58;
          uStack_1ac0 = uStack_1b50;
          local_1aa8 = local_1e68;
          uStack_1aa0 = uStack_1e60;
          _local_1a18 = _local_1b48;
          local_1a08 = local_1e58;
          uStack_1a00 = uStack_1e50;
          break;
        default:
          _local_1e08 = local_2698;
        }
        local_2698 = _local_1e08;
        local_1d80 = local_2638;
        local_1d98 = local_1e08;
        uStack_1d90 = uStack_1e00;
        *local_2638 = local_1e08;
        local_2638[1] = uStack_1e00;
        local_2638 = local_2638 + 2;
        local_2528 = local_2580;
        local_26c8 = local_d8;
      }
    }
    local_2508 = local_2590;
    local_2660 = local_68;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffd424,in_stack_ffffffffffffd420));
  return;
}

Assistant:

static void convolution_pack16to4_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    const float* bias_data_ptr = bias_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128 _sum = _mm_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm_loadu_ps(bias_data_ptr + p * 4);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                    for (int k = 0; k < maxk; k++)
                    {
                        const float* slptr = sptr + space_ofs[k] * 16;

                        __m128 _val0 = _mm_broadcast_ss(slptr);
                        __m128 _val1 = _mm_broadcast_ss(slptr + 1);
                        __m128 _val2 = _mm_broadcast_ss(slptr + 2);
                        __m128 _val3 = _mm_broadcast_ss(slptr + 3);
                        __m128 _val4 = _mm_broadcast_ss(slptr + 4);
                        __m128 _val5 = _mm_broadcast_ss(slptr + 5);
                        __m128 _val6 = _mm_broadcast_ss(slptr + 6);
                        __m128 _val7 = _mm_broadcast_ss(slptr + 7);
                        __m128 _val8 = _mm_broadcast_ss(slptr + 8);
                        __m128 _val9 = _mm_broadcast_ss(slptr + 9);
                        __m128 _vala = _mm_broadcast_ss(slptr + 10);
                        __m128 _valb = _mm_broadcast_ss(slptr + 11);
                        __m128 _valc = _mm_broadcast_ss(slptr + 12);
                        __m128 _vald = _mm_broadcast_ss(slptr + 13);
                        __m128 _vale = _mm_broadcast_ss(slptr + 14);
                        __m128 _valf = _mm_broadcast_ss(slptr + 15);

                        __m128 _w0 = _mm_load_ps(kptr + 4 * 0);
                        __m128 _w1 = _mm_load_ps(kptr + 4 * 1);
                        __m128 _w2 = _mm_load_ps(kptr + 4 * 2);
                        __m128 _w3 = _mm_load_ps(kptr + 4 * 3);
                        __m128 _w4 = _mm_load_ps(kptr + 4 * 4);
                        __m128 _w5 = _mm_load_ps(kptr + 4 * 5);
                        __m128 _w6 = _mm_load_ps(kptr + 4 * 6);
                        __m128 _w7 = _mm_load_ps(kptr + 4 * 7);
                        __m128 _w8 = _mm_load_ps(kptr + 4 * 8);
                        __m128 _w9 = _mm_load_ps(kptr + 4 * 9);
                        __m128 _wa = _mm_load_ps(kptr + 4 * 10);
                        __m128 _wb = _mm_load_ps(kptr + 4 * 11);
                        __m128 _wc = _mm_load_ps(kptr + 4 * 12);
                        __m128 _wd = _mm_load_ps(kptr + 4 * 13);
                        __m128 _we = _mm_load_ps(kptr + 4 * 14);
                        __m128 _wf = _mm_load_ps(kptr + 4 * 15);

                        _sum = _mm_fmadd_ps(_val0, _w0, _sum);
                        _sum = _mm_fmadd_ps(_val1, _w1, _sum);
                        _sum = _mm_fmadd_ps(_val2, _w2, _sum);
                        _sum = _mm_fmadd_ps(_val3, _w3, _sum);
                        _sum = _mm_fmadd_ps(_val4, _w4, _sum);
                        _sum = _mm_fmadd_ps(_val5, _w5, _sum);
                        _sum = _mm_fmadd_ps(_val6, _w6, _sum);
                        _sum = _mm_fmadd_ps(_val7, _w7, _sum);
                        _sum = _mm_fmadd_ps(_val8, _w8, _sum);
                        _sum = _mm_fmadd_ps(_val9, _w9, _sum);
                        _sum = _mm_fmadd_ps(_vala, _wa, _sum);
                        _sum = _mm_fmadd_ps(_valb, _wb, _sum);
                        _sum = _mm_fmadd_ps(_valc, _wc, _sum);
                        _sum = _mm_fmadd_ps(_vald, _wd, _sum);
                        _sum = _mm_fmadd_ps(_vale, _we, _sum);
                        _sum = _mm_fmadd_ps(_valf, _wf, _sum);

                        kptr += 64;
                    }
                }

                _sum = activation_sse(_sum, activation_type, activation_params);

                _mm_storeu_ps(outptr, _sum);
                outptr += 4;
            }
        }
    }
}